

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  _func_int *p_Var8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int *piVar19;
  undefined1 auVar20 [16];
  void *pvVar21;
  char cVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  _func_int ***ppp_Var40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  void *pvVar45;
  _func_int ***ppp_Var46;
  int iVar47;
  float *pfVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  float *pfVar54;
  undefined4 *puVar55;
  int iVar56;
  long lVar57;
  undefined4 *puVar58;
  long lVar59;
  long lVar60;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar67 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float fVar68;
  float fVar83;
  float fVar84;
  float sum [4];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar110 [28];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar154 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar143;
  float fVar147;
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 in_ZMM3 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  undefined1 in_ZMM4 [64];
  undefined1 auVar153 [64];
  undefined1 auVar157 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [64];
  undefined1 auVar169 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar170 [32];
  undefined1 auVar168 [16];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar175 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  int elempack;
  Allocator *local_200;
  ulong local_1f8;
  void *local_1e0;
  undefined1 (*local_1d0) [32];
  ulong local_1c8;
  undefined1 local_1a8 [16];
  uint local_198;
  undefined1 (*local_188) [16];
  ulong local_180;
  ulong local_170;
  long local_158;
  long local_150;
  undefined1 local_118 [16];
  uint local_f0;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  void *local_38;
  undefined1 auVar118 [32];
  undefined1 auVar134 [32];
  undefined1 auVar138 [32];
  
  uVar32 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var8 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var8);
  iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var8);
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elempack = 0;
  local_c8.h = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.d = (int)local_c8.refcount;
  local_c8.c = local_c8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx + (long)p_Var8),bottom_blob,
             &local_c8,opt);
  iVar47 = -100;
  if (((Allocator *)local_c8.data != (Allocator *)0x0) && ((long)local_c8.c * local_c8.cstep != 0))
  {
    uVar37 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    lVar28 = 1;
    if (opt->use_packing_layout == true) {
      lVar28 = 8;
      if ((uVar37 & 7) != 0) {
        lVar28 = (ulong)((uVar37 & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_c8.w + ~((iVar5 + -1) * iVar6)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]) +
                         1,(int)uVar37 / (int)lVar28,lVar28 * (uVar32 / (ulong)(long)iVar4),
                (int)lVar28,opt->blob_allocator);
    iVar4 = local_c8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var8 = this->_vptr_Convolution1D_x86_avx[-3];
      iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var8);
      uVar37 = *(uint *)(&this->field_0xf4 + (long)p_Var8);
      local_78 = (ulong)uVar37;
      iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var8);
      lVar28 = (long)iVar6;
      iVar47 = *(int *)(&this->field_0xdc + (long)p_Var8);
      lVar29 = (long)iVar47;
      uVar23 = local_c8.h * local_c8.elempack;
      iVar24 = local_c8.w * local_c8.elempack;
      local_58 = (long)top_blob->w;
      local_80 = (long)top_blob->h * (long)top_blob->elempack;
      lVar57 = top_blob->elempack * local_58;
      iVar27 = (int)local_80;
      iVar56 = iVar27 + 7;
      if (-1 < iVar27) {
        iVar56 = iVar27;
      }
      lVar9 = *(long *)(&this->field_0x190 + (long)p_Var8);
      uVar49 = iVar56 >> 3;
      lVar59 = (long)iVar24;
      iVar56 = (int)lVar57;
      if (7 < iVar27) {
        auVar173 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar153 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
        local_70 = lVar59 * 4;
        local_1f8 = 0;
        do {
          lVar30 = (long)top_blob->w;
          if (0 < lVar30) {
            uVar50 = local_c8.h * local_c8.elempack;
            iVar53 = top_blob->elempack;
            local_1d0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1f8 * 8) >> 0x1f) << 0x20 |
                                     local_1f8 * 8 & 0xffffffff) / (long)iVar53) * lVar30 *
                         top_blob->elemsize + (long)top_blob->data);
            auVar122._8_8_ = 0;
            auVar122._0_8_ = local_118._8_8_;
            local_118 = auVar122 << 0x40;
            iVar43 = 0;
            auVar154._8_8_ = 0;
            auVar154._0_8_ = local_1a8._8_8_;
            local_1a8 = auVar154 << 0x40;
            local_150 = local_70;
            do {
              auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar177 = 0.0;
              fVar178 = 0.0;
              fVar174 = 0.0;
              fVar176 = 0.0;
              fVar179 = 0.0;
              fVar180 = 0.0;
              fVar181 = 0.0;
              fVar182 = 0.0;
              if (lVar9 != 0) {
                pfVar48 = (float *)(lVar9 + local_1f8 * 0x20);
                fVar174 = *pfVar48;
                fVar176 = pfVar48[1];
                fVar177 = pfVar48[2];
                fVar178 = pfVar48[3];
                fVar179 = pfVar48[4];
                fVar180 = pfVar48[5];
                fVar181 = pfVar48[6];
                fVar182 = pfVar48[7];
              }
              pfVar48 = (float *)((this->weight_data_tm).cstep * local_1f8 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar50 < 8) {
                fVar68 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                fVar88 = 0.0;
                fVar89 = 0.0;
                fVar185 = 0.0;
                fVar186 = 0.0;
                fVar187 = 0.0;
                fVar188 = 0.0;
                fVar189 = 0.0;
                fVar190 = 0.0;
                fVar191 = 0.0;
                fVar192 = 0.0;
                uVar25 = 0;
              }
              else {
                fVar185 = 0.0;
                fVar186 = 0.0;
                fVar187 = 0.0;
                fVar188 = 0.0;
                fVar189 = 0.0;
                fVar190 = 0.0;
                fVar191 = 0.0;
                fVar192 = 0.0;
                fVar68 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                fVar88 = 0.0;
                fVar89 = 0.0;
                iVar42 = 0;
                do {
                  lVar31 = (long)(iVar42 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar31 + (long)iVar43 * 4);
                      iVar41 = iVar5;
                      do {
                        fVar152 = *pfVar54;
                        fVar1 = pfVar54[1];
                        fVar2 = pfVar54[2];
                        fVar147 = pfVar54[3];
                        fVar3 = pfVar54[4];
                        fVar120 = fVar147 * pfVar48[0x18] + auVar158._0_4_;
                        fVar141 = fVar147 * pfVar48[0x19] + auVar158._4_4_;
                        fVar142 = fVar147 * pfVar48[0x1a] + auVar158._8_4_;
                        fVar143 = fVar147 * pfVar48[0x1b] + auVar158._12_4_;
                        fVar144 = fVar147 * pfVar48[0x1c] + auVar158._16_4_;
                        fVar145 = fVar147 * pfVar48[0x1d] + auVar158._20_4_;
                        fVar146 = fVar147 * pfVar48[0x1e] + auVar158._24_4_;
                        fVar147 = fVar147 + auVar158._28_4_;
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar146,CONCAT420(fVar145,
                                                  CONCAT416(fVar144,CONCAT412(fVar143,CONCAT48(
                                                  fVar142,CONCAT44(fVar141,fVar120))))))));
                        fVar174 = fVar3 * pfVar48[0x20] + fVar174 + fVar152 * *pfVar48;
                        fVar176 = fVar3 * pfVar48[0x21] + fVar176 + fVar152 * pfVar48[1];
                        fVar177 = fVar3 * pfVar48[0x22] + fVar177 + fVar152 * pfVar48[2];
                        fVar178 = fVar3 * pfVar48[0x23] + fVar178 + fVar152 * pfVar48[3];
                        fVar179 = fVar3 * pfVar48[0x24] + fVar179 + fVar152 * pfVar48[4];
                        fVar180 = fVar3 * pfVar48[0x25] + fVar180 + fVar152 * pfVar48[5];
                        fVar181 = fVar3 * pfVar48[0x26] + fVar181 + fVar152 * pfVar48[6];
                        fVar182 = fVar3 + fVar182 + fVar152;
                        fVar152 = pfVar54[5];
                        fVar3 = pfVar54[6];
                        fVar185 = fVar1 * pfVar48[8] + fVar185 + fVar152 * pfVar48[0x28];
                        fVar186 = fVar1 * pfVar48[9] + fVar186 + fVar152 * pfVar48[0x29];
                        fVar187 = fVar1 * pfVar48[10] + fVar187 + fVar152 * pfVar48[0x2a];
                        fVar188 = fVar1 * pfVar48[0xb] + fVar188 + fVar152 * pfVar48[0x2b];
                        fVar189 = fVar1 * pfVar48[0xc] + fVar189 + fVar152 * pfVar48[0x2c];
                        fVar190 = fVar1 * pfVar48[0xd] + fVar190 + fVar152 * pfVar48[0x2d];
                        fVar191 = fVar1 * pfVar48[0xe] + fVar191 + fVar152 * pfVar48[0x2e];
                        fVar192 = fVar1 + fVar192 + fVar152;
                        fVar68 = fVar2 * pfVar48[0x10] + fVar68 + fVar3 * pfVar48[0x30];
                        fVar83 = fVar2 * pfVar48[0x11] + fVar83 + fVar3 * pfVar48[0x31];
                        fVar84 = fVar2 * pfVar48[0x12] + fVar84 + fVar3 * pfVar48[0x32];
                        fVar85 = fVar2 * pfVar48[0x13] + fVar85 + fVar3 * pfVar48[0x33];
                        fVar86 = fVar2 * pfVar48[0x14] + fVar86 + fVar3 * pfVar48[0x34];
                        fVar87 = fVar2 * pfVar48[0x15] + fVar87 + fVar3 * pfVar48[0x35];
                        fVar88 = fVar2 * pfVar48[0x16] + fVar88 + fVar3 * pfVar48[0x36];
                        fVar89 = fVar2 + fVar89 + fVar152;
                        fVar152 = pfVar54[7];
                        auVar158 = ZEXT3264(CONCAT428(fVar147 + fVar152,
                                                      CONCAT424(fVar146 + fVar152 * pfVar48[0x3e],
                                                                CONCAT420(fVar145 + fVar152 * 
                                                  pfVar48[0x3d],
                                                  CONCAT416(fVar144 + fVar152 * pfVar48[0x3c],
                                                            CONCAT412(fVar143 + fVar152 * pfVar48[
                                                  0x3b],CONCAT48(fVar142 + fVar152 * pfVar48[0x3a],
                                                                 CONCAT44(fVar141 + fVar152 * 
                                                  pfVar48[0x39],fVar120 + fVar152 * pfVar48[0x38])))
                                                  )))));
                        pfVar48 = pfVar48 + 0x40;
                        pfVar54 = pfVar54 + iVar6 * 8;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_00503418;
                    }
                  }
                  else {
                    pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar31 + (long)(iVar47 * local_c8.elempack * local_1a8._0_4_)
                                                * 4);
LAB_00503418:
                    if (local_c8.elempack == 4) {
                      iVar41 = iVar5;
                      if (iVar5 < 1) goto LAB_00503579;
                      do {
                        fVar152 = *pfVar54;
                        fVar1 = pfVar54[1];
                        fVar2 = pfVar54[2];
                        fVar185 = fVar185 + fVar1 * pfVar48[8];
                        fVar186 = fVar186 + fVar1 * pfVar48[9];
                        fVar187 = fVar187 + fVar1 * pfVar48[10];
                        fVar188 = fVar188 + fVar1 * pfVar48[0xb];
                        fVar189 = fVar189 + fVar1 * pfVar48[0xc];
                        fVar190 = fVar190 + fVar1 * pfVar48[0xd];
                        fVar191 = fVar191 + fVar1 * pfVar48[0xe];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar192 + fVar1,
                                                     CONCAT424(fVar191,CONCAT420(fVar190,CONCAT416(
                                                  fVar189,CONCAT412(fVar188,CONCAT48(fVar187,
                                                  CONCAT44(fVar186,fVar185))))))));
                        fVar147 = pfVar54[3];
                        fVar3 = pfVar54[lVar59];
                        fVar174 = fVar3 * pfVar48[0x20] + fVar174 + fVar152 * *pfVar48;
                        fVar176 = fVar3 * pfVar48[0x21] + fVar176 + fVar152 * pfVar48[1];
                        fVar177 = fVar3 * pfVar48[0x22] + fVar177 + fVar152 * pfVar48[2];
                        fVar178 = fVar3 * pfVar48[0x23] + fVar178 + fVar152 * pfVar48[3];
                        fVar179 = fVar3 * pfVar48[0x24] + fVar179 + fVar152 * pfVar48[4];
                        fVar180 = fVar3 * pfVar48[0x25] + fVar180 + fVar152 * pfVar48[5];
                        fVar181 = fVar3 * pfVar48[0x26] + fVar181 + fVar152 * pfVar48[6];
                        fVar182 = fVar3 + fVar182 + fVar152;
                        fVar152 = pfVar54[lVar59 + 1];
                        fVar3 = pfVar54[lVar59 + 2];
                        fVar185 = fVar185 + fVar152 * pfVar48[0x28];
                        fVar186 = fVar186 + fVar152 * pfVar48[0x29];
                        fVar187 = fVar187 + fVar152 * pfVar48[0x2a];
                        fVar188 = fVar188 + fVar152 * pfVar48[0x2b];
                        fVar189 = fVar189 + fVar152 * pfVar48[0x2c];
                        fVar190 = fVar190 + fVar152 * pfVar48[0x2d];
                        fVar191 = fVar191 + fVar152 * pfVar48[0x2e];
                        fVar192 = fVar192 + fVar1 + fVar152;
                        fVar68 = fVar2 * pfVar48[0x10] + fVar68 + fVar3 * pfVar48[0x30];
                        fVar83 = fVar2 * pfVar48[0x11] + fVar83 + fVar3 * pfVar48[0x31];
                        fVar84 = fVar2 * pfVar48[0x12] + fVar84 + fVar3 * pfVar48[0x32];
                        fVar85 = fVar2 * pfVar48[0x13] + fVar85 + fVar3 * pfVar48[0x33];
                        fVar86 = fVar2 * pfVar48[0x14] + fVar86 + fVar3 * pfVar48[0x34];
                        fVar87 = fVar2 * pfVar48[0x15] + fVar87 + fVar3 * pfVar48[0x35];
                        fVar88 = fVar2 * pfVar48[0x16] + fVar88 + fVar3 * pfVar48[0x36];
                        fVar89 = fVar2 + fVar89 + fVar152;
                        fVar152 = pfVar54[lVar59 + 3];
                        auVar158 = ZEXT3264(CONCAT428(fVar147 + auVar158._28_4_ + fVar152,
                                                      CONCAT424(fVar147 * pfVar48[0x1e] +
                                                                auVar158._24_4_ +
                                                                fVar152 * pfVar48[0x3e],
                                                                CONCAT420(fVar147 * pfVar48[0x1d] +
                                                                          auVar158._20_4_ +
                                                                          fVar152 * pfVar48[0x3d],
                                                                          CONCAT416(fVar147 * 
                                                  pfVar48[0x1c] + auVar158._16_4_ +
                                                  fVar152 * pfVar48[0x3c],
                                                  CONCAT412(fVar147 * pfVar48[0x1b] +
                                                            auVar158._12_4_ +
                                                            fVar152 * pfVar48[0x3b],
                                                            CONCAT48(fVar147 * pfVar48[0x1a] +
                                                                     auVar158._8_4_ +
                                                                     fVar152 * pfVar48[0x3a],
                                                                     CONCAT44(fVar147 * pfVar48[0x19
                                                  ] + auVar158._4_4_ + fVar152 * pfVar48[0x39],
                                                  fVar147 * pfVar48[0x18] + auVar158._0_4_ +
                                                  fVar152 * pfVar48[0x38]))))))));
                        pfVar48 = pfVar48 + 0x40;
                        pfVar54 = pfVar54 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        fVar152 = *pfVar54;
                        fVar1 = pfVar54[lVar59];
                        fVar2 = pfVar54[iVar24 * 2];
                        fVar185 = fVar185 + fVar1 * pfVar48[8];
                        fVar186 = fVar186 + fVar1 * pfVar48[9];
                        fVar187 = fVar187 + fVar1 * pfVar48[10];
                        fVar188 = fVar188 + fVar1 * pfVar48[0xb];
                        fVar189 = fVar189 + fVar1 * pfVar48[0xc];
                        fVar190 = fVar190 + fVar1 * pfVar48[0xd];
                        fVar191 = fVar191 + fVar1 * pfVar48[0xe];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar192 + fVar1,
                                                     CONCAT424(fVar191,CONCAT420(fVar190,CONCAT416(
                                                  fVar189,CONCAT412(fVar188,CONCAT48(fVar187,
                                                  CONCAT44(fVar186,fVar185))))))));
                        fVar147 = pfVar54[iVar24 * 3];
                        fVar3 = pfVar54[iVar24 * 4];
                        fVar174 = fVar3 * pfVar48[0x20] + fVar174 + fVar152 * *pfVar48;
                        fVar176 = fVar3 * pfVar48[0x21] + fVar176 + fVar152 * pfVar48[1];
                        fVar177 = fVar3 * pfVar48[0x22] + fVar177 + fVar152 * pfVar48[2];
                        fVar178 = fVar3 * pfVar48[0x23] + fVar178 + fVar152 * pfVar48[3];
                        fVar179 = fVar3 * pfVar48[0x24] + fVar179 + fVar152 * pfVar48[4];
                        fVar180 = fVar3 * pfVar48[0x25] + fVar180 + fVar152 * pfVar48[5];
                        fVar181 = fVar3 * pfVar48[0x26] + fVar181 + fVar152 * pfVar48[6];
                        fVar182 = fVar3 + fVar182 + fVar152;
                        fVar152 = pfVar54[iVar24 * 5];
                        fVar3 = pfVar54[iVar24 * 6];
                        fVar185 = fVar185 + fVar152 * pfVar48[0x28];
                        fVar186 = fVar186 + fVar152 * pfVar48[0x29];
                        fVar187 = fVar187 + fVar152 * pfVar48[0x2a];
                        fVar188 = fVar188 + fVar152 * pfVar48[0x2b];
                        fVar189 = fVar189 + fVar152 * pfVar48[0x2c];
                        fVar190 = fVar190 + fVar152 * pfVar48[0x2d];
                        fVar191 = fVar191 + fVar152 * pfVar48[0x2e];
                        fVar192 = fVar192 + fVar1 + fVar152;
                        fVar68 = fVar2 * pfVar48[0x10] + fVar68 + fVar3 * pfVar48[0x30];
                        fVar83 = fVar2 * pfVar48[0x11] + fVar83 + fVar3 * pfVar48[0x31];
                        fVar84 = fVar2 * pfVar48[0x12] + fVar84 + fVar3 * pfVar48[0x32];
                        fVar85 = fVar2 * pfVar48[0x13] + fVar85 + fVar3 * pfVar48[0x33];
                        fVar86 = fVar2 * pfVar48[0x14] + fVar86 + fVar3 * pfVar48[0x34];
                        fVar87 = fVar2 * pfVar48[0x15] + fVar87 + fVar3 * pfVar48[0x35];
                        fVar88 = fVar2 * pfVar48[0x16] + fVar88 + fVar3 * pfVar48[0x36];
                        fVar89 = fVar2 + fVar89 + fVar152;
                        fVar152 = pfVar54[iVar24 * 7];
                        auVar158 = ZEXT3264(CONCAT428(fVar147 + auVar158._28_4_ + fVar152,
                                                      CONCAT424(fVar147 * pfVar48[0x1e] +
                                                                auVar158._24_4_ +
                                                                fVar152 * pfVar48[0x3e],
                                                                CONCAT420(fVar147 * pfVar48[0x1d] +
                                                                          auVar158._20_4_ +
                                                                          fVar152 * pfVar48[0x3d],
                                                                          CONCAT416(fVar147 * 
                                                  pfVar48[0x1c] + auVar158._16_4_ +
                                                  fVar152 * pfVar48[0x3c],
                                                  CONCAT412(fVar147 * pfVar48[0x1b] +
                                                            auVar158._12_4_ +
                                                            fVar152 * pfVar48[0x3b],
                                                            CONCAT48(fVar147 * pfVar48[0x1a] +
                                                                     auVar158._8_4_ +
                                                                     fVar152 * pfVar48[0x3a],
                                                                     CONCAT44(fVar147 * pfVar48[0x19
                                                  ] + auVar158._4_4_ + fVar152 * pfVar48[0x39],
                                                  fVar147 * pfVar48[0x18] + auVar158._0_4_ +
                                                  fVar152 * pfVar48[0x38]))))))));
                        pfVar48 = pfVar48 + 0x40;
                        pfVar54 = pfVar54 + lVar28;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
LAB_00503579:
                  iVar41 = iVar42 + 0xf;
                  iVar42 = iVar42 + 8;
                  uVar25 = uVar50 & 0xfffffff8;
                } while (iVar41 < (int)uVar50);
              }
              auVar138 = auVar158._0_32_;
              if ((int)(uVar25 | 3) < (int)uVar50) {
                uVar51 = uVar25;
                do {
                  lVar31 = (long)((int)uVar51 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar31 + (long)iVar43 * 4);
                      iVar42 = iVar5;
                      do {
                        fVar152 = *pfVar54;
                        fVar174 = fVar174 + fVar152 * *pfVar48;
                        fVar176 = fVar176 + fVar152 * pfVar48[1];
                        fVar177 = fVar177 + fVar152 * pfVar48[2];
                        fVar178 = fVar178 + fVar152 * pfVar48[3];
                        fVar179 = fVar179 + fVar152 * pfVar48[4];
                        fVar180 = fVar180 + fVar152 * pfVar48[5];
                        fVar181 = fVar181 + fVar152 * pfVar48[6];
                        fVar182 = fVar182 + fVar152;
                        fVar152 = pfVar54[1];
                        fVar1 = pfVar54[2];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416
                                                  (fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                        fVar185 = fVar185 + fVar152 * pfVar48[8];
                        fVar186 = fVar186 + fVar152 * pfVar48[9];
                        fVar187 = fVar187 + fVar152 * pfVar48[10];
                        fVar188 = fVar188 + fVar152 * pfVar48[0xb];
                        fVar189 = fVar189 + fVar152 * pfVar48[0xc];
                        fVar190 = fVar190 + fVar152 * pfVar48[0xd];
                        fVar191 = fVar191 + fVar152 * pfVar48[0xe];
                        fVar192 = fVar192 + fVar152;
                        fVar68 = fVar1 * pfVar48[0x10] + fVar68;
                        fVar83 = fVar1 * pfVar48[0x11] + fVar83;
                        fVar84 = fVar1 * pfVar48[0x12] + fVar84;
                        fVar85 = fVar1 * pfVar48[0x13] + fVar85;
                        fVar86 = fVar1 * pfVar48[0x14] + fVar86;
                        fVar87 = fVar1 * pfVar48[0x15] + fVar87;
                        fVar88 = fVar1 * pfVar48[0x16] + fVar88;
                        fVar89 = fVar152 + fVar89;
                        fVar152 = pfVar54[3];
                        auVar158 = ZEXT3264(CONCAT428(fVar152 + auVar158._28_4_,
                                                      CONCAT424(fVar152 * pfVar48[0x1e] +
                                                                auVar158._24_4_,
                                                                CONCAT420(fVar152 * pfVar48[0x1d] +
                                                                          auVar158._20_4_,
                                                                          CONCAT416(fVar152 * 
                                                  pfVar48[0x1c] + auVar158._16_4_,
                                                  CONCAT412(fVar152 * pfVar48[0x1b] +
                                                            auVar158._12_4_,
                                                            CONCAT48(fVar152 * pfVar48[0x1a] +
                                                                     auVar158._8_4_,
                                                                     CONCAT44(fVar152 * pfVar48[0x19
                                                  ] + auVar158._4_4_,
                                                  fVar152 * pfVar48[0x18] + auVar158._0_4_))))))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar54 = pfVar54 + iVar6 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_00503654;
                    }
                  }
                  else {
                    pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar31 + (long)(iVar47 * local_c8.elempack * local_1a8._0_4_)
                                                * 4);
LAB_00503654:
                    if ((local_c8.elempack == 1) && (iVar42 = iVar5, 0 < iVar5)) {
                      do {
                        fVar152 = *pfVar54;
                        fVar174 = fVar174 + fVar152 * *pfVar48;
                        fVar176 = fVar176 + fVar152 * pfVar48[1];
                        fVar177 = fVar177 + fVar152 * pfVar48[2];
                        fVar178 = fVar178 + fVar152 * pfVar48[3];
                        fVar179 = fVar179 + fVar152 * pfVar48[4];
                        fVar180 = fVar180 + fVar152 * pfVar48[5];
                        fVar181 = fVar181 + fVar152 * pfVar48[6];
                        fVar182 = fVar182 + fVar152;
                        fVar152 = pfVar54[lVar59];
                        fVar1 = pfVar54[iVar24 * 2];
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416
                                                  (fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                        fVar185 = fVar185 + fVar152 * pfVar48[8];
                        fVar186 = fVar186 + fVar152 * pfVar48[9];
                        fVar187 = fVar187 + fVar152 * pfVar48[10];
                        fVar188 = fVar188 + fVar152 * pfVar48[0xb];
                        fVar189 = fVar189 + fVar152 * pfVar48[0xc];
                        fVar190 = fVar190 + fVar152 * pfVar48[0xd];
                        fVar191 = fVar191 + fVar152 * pfVar48[0xe];
                        fVar192 = fVar192 + fVar152;
                        fVar68 = fVar1 * pfVar48[0x10] + fVar68;
                        fVar83 = fVar1 * pfVar48[0x11] + fVar83;
                        fVar84 = fVar1 * pfVar48[0x12] + fVar84;
                        fVar85 = fVar1 * pfVar48[0x13] + fVar85;
                        fVar86 = fVar1 * pfVar48[0x14] + fVar86;
                        fVar87 = fVar1 * pfVar48[0x15] + fVar87;
                        fVar88 = fVar1 * pfVar48[0x16] + fVar88;
                        fVar89 = fVar152 + fVar89;
                        fVar152 = pfVar54[iVar24 * 3];
                        auVar158 = ZEXT3264(CONCAT428(fVar152 + auVar158._28_4_,
                                                      CONCAT424(fVar152 * pfVar48[0x1e] +
                                                                auVar158._24_4_,
                                                                CONCAT420(fVar152 * pfVar48[0x1d] +
                                                                          auVar158._20_4_,
                                                                          CONCAT416(fVar152 * 
                                                  pfVar48[0x1c] + auVar158._16_4_,
                                                  CONCAT412(fVar152 * pfVar48[0x1b] +
                                                            auVar158._12_4_,
                                                            CONCAT48(fVar152 * pfVar48[0x1a] +
                                                                     auVar158._8_4_,
                                                                     CONCAT44(fVar152 * pfVar48[0x19
                                                  ] + auVar158._4_4_,
                                                  fVar152 * pfVar48[0x18] + auVar158._0_4_))))))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar54 = pfVar54 + lVar28;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  auVar138 = auVar158._0_32_;
                  uVar25 = uVar51 + 4;
                  iVar42 = uVar51 + 7;
                  uVar51 = uVar25;
                } while (iVar42 < (int)uVar50);
              }
              uVar32 = (ulong)uVar25;
              if ((int)(uVar25 | 1) < (int)uVar50) {
                lVar38 = (long)local_c8.w * local_c8.elemsize * uVar32;
                lVar60 = (long)(_func_int ***)local_c8.data + lVar38 + local_150;
                lVar31 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar38 = (long)(_func_int ***)local_c8.data + lVar38 + local_118._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar39 = 0;
                    iVar42 = iVar5;
                    do {
                      fVar152 = *(float *)(lVar38 + lVar39);
                      fVar174 = fVar174 + fVar152 * *pfVar48;
                      fVar176 = fVar176 + fVar152 * pfVar48[1];
                      fVar177 = fVar177 + fVar152 * pfVar48[2];
                      fVar178 = fVar178 + fVar152 * pfVar48[3];
                      fVar179 = fVar179 + fVar152 * pfVar48[4];
                      fVar180 = fVar180 + fVar152 * pfVar48[5];
                      fVar181 = fVar181 + fVar152 * pfVar48[6];
                      fVar182 = fVar182 + fVar152;
                      fVar152 = *(float *)(lVar60 + lVar39);
                      fVar185 = fVar185 + fVar152 * pfVar48[8];
                      fVar186 = fVar186 + fVar152 * pfVar48[9];
                      fVar187 = fVar187 + fVar152 * pfVar48[10];
                      fVar188 = fVar188 + fVar152 * pfVar48[0xb];
                      fVar189 = fVar189 + fVar152 * pfVar48[0xc];
                      fVar190 = fVar190 + fVar152 * pfVar48[0xd];
                      fVar191 = fVar191 + fVar152 * pfVar48[0xe];
                      fVar192 = fVar192 + fVar152;
                      pfVar48 = pfVar48 + 0x10;
                      lVar39 = lVar39 + lVar28 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar32 = uVar32 + 2;
                  uVar25 = (uint)uVar32;
                  lVar60 = lVar60 + lVar31;
                  lVar38 = lVar38 + lVar31;
                } while ((int)(uVar25 | 1) < (int)uVar50);
              }
              if ((int)uVar25 < (int)uVar50) {
                uVar32 = (ulong)uVar25;
                pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                   (long)local_c8.w * local_c8.elemsize * uVar32 + local_118._0_8_);
                do {
                  pfVar35 = pfVar54;
                  iVar42 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar152 = *pfVar35;
                      fVar174 = fVar174 + fVar152 * *pfVar48;
                      fVar176 = fVar176 + fVar152 * pfVar48[1];
                      fVar177 = fVar177 + fVar152 * pfVar48[2];
                      fVar178 = fVar178 + fVar152 * pfVar48[3];
                      fVar179 = fVar179 + fVar152 * pfVar48[4];
                      fVar180 = fVar180 + fVar152 * pfVar48[5];
                      fVar181 = fVar181 + fVar152 * pfVar48[6];
                      fVar182 = fVar182 + fVar152;
                      pfVar48 = pfVar48 + 8;
                      pfVar35 = pfVar35 + lVar28;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar32 = uVar32 + 1;
                  pfVar54 = (float *)((long)pfVar54 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar32 < (int)uVar50);
              }
              fVar68 = fVar68 + auVar138._0_4_ + fVar185 + fVar174;
              fVar83 = fVar83 + auVar138._4_4_ + fVar186 + fVar176;
              auVar80._0_8_ = CONCAT44(fVar83,fVar68);
              auVar80._8_4_ = fVar84 + auVar138._8_4_ + fVar187 + fVar177;
              auVar80._12_4_ = fVar85 + auVar138._12_4_ + fVar188 + fVar178;
              auVar80._16_4_ = fVar86 + auVar138._16_4_ + fVar189 + fVar179;
              auVar80._20_4_ = fVar87 + auVar138._20_4_ + fVar190 + fVar180;
              auVar80._24_4_ = fVar88 + auVar138._24_4_ + fVar191 + fVar181;
              auVar80._28_4_ = fVar89 + auVar138._28_4_ + fVar192 + fVar182;
              auVar169 = auVar171._0_32_;
              fVar84 = auVar173._0_4_;
              fVar85 = auVar173._4_4_;
              fVar86 = auVar173._8_4_;
              fVar87 = auVar173._12_4_;
              fVar88 = auVar173._16_4_;
              fVar89 = auVar173._20_4_;
              fVar185 = auVar173._24_4_;
              fVar186 = auVar173._28_4_;
              auVar138 = auVar153._0_32_;
              fVar174 = auVar153._0_4_;
              fVar176 = auVar153._4_4_;
              fVar177 = auVar153._8_4_;
              fVar178 = auVar153._12_4_;
              fVar179 = auVar153._16_4_;
              fVar180 = auVar153._20_4_;
              fVar181 = auVar153._24_4_;
              fVar182 = auVar153._28_4_;
              switch(uVar37) {
              case 1:
                auVar80 = vmaxps_avx(auVar169,auVar80);
                break;
              case 2:
                auVar138 = vmaxps_avx(auVar169,auVar80);
                auVar169 = vminps_avx(auVar169,auVar80);
                fVar174 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                in_ZMM3 = ZEXT3264(CONCAT428(fVar174,CONCAT424(fVar174,CONCAT420(fVar174,CONCAT416(
                                                  fVar174,CONCAT412(fVar174,CONCAT48(fVar174,
                                                  CONCAT44(fVar174,fVar174))))))));
                auVar80._0_4_ = fVar174 * auVar169._0_4_ + auVar138._0_4_;
                auVar80._4_4_ = fVar174 * auVar169._4_4_ + auVar138._4_4_;
                auVar80._8_4_ = fVar174 * auVar169._8_4_ + auVar138._8_4_;
                auVar80._12_4_ = fVar174 * auVar169._12_4_ + auVar138._12_4_;
                auVar80._16_4_ = fVar174 * auVar169._16_4_ + auVar138._16_4_;
                auVar80._20_4_ = fVar174 * auVar169._20_4_ + auVar138._20_4_;
                auVar80._24_4_ = fVar174 * auVar169._24_4_ + auVar138._24_4_;
                auVar80._28_4_ = auVar169._28_4_ + auVar138._28_4_;
                break;
              case 3:
                uVar7 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var8);
                auVar114._4_4_ = uVar7;
                auVar114._0_4_ = uVar7;
                auVar114._8_4_ = uVar7;
                auVar114._12_4_ = uVar7;
                auVar114._16_4_ = uVar7;
                auVar114._20_4_ = uVar7;
                auVar114._24_4_ = uVar7;
                auVar114._28_4_ = uVar7;
                uVar7 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar140._4_4_ = uVar7;
                auVar140._0_4_ = uVar7;
                auVar140._8_4_ = uVar7;
                auVar140._12_4_ = uVar7;
                auVar140._16_4_ = uVar7;
                auVar140._20_4_ = uVar7;
                auVar140._24_4_ = uVar7;
                auVar140._28_4_ = uVar7;
                in_ZMM3 = ZEXT3264(auVar140);
                auVar138 = vmaxps_avx(auVar80,auVar114);
                auVar80 = vminps_avx(auVar138,auVar140);
                break;
              case 4:
                auVar81._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
                auVar81._8_4_ = -auVar80._8_4_;
                auVar81._12_4_ = -auVar80._12_4_;
                auVar81._16_4_ = -auVar80._16_4_;
                auVar81._20_4_ = -auVar80._20_4_;
                auVar81._24_4_ = -auVar80._24_4_;
                auVar81._28_4_ = -auVar80._28_4_;
                auVar115._8_4_ = 0x42b0c0a5;
                auVar115._0_8_ = 0x42b0c0a542b0c0a5;
                auVar115._12_4_ = 0x42b0c0a5;
                auVar115._16_4_ = 0x42b0c0a5;
                auVar115._20_4_ = 0x42b0c0a5;
                auVar115._24_4_ = 0x42b0c0a5;
                auVar115._28_4_ = 0x42b0c0a5;
                auVar80 = vminps_avx(auVar81,auVar115);
                auVar116._8_4_ = 0xc2b0c0a5;
                auVar116._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar116._12_4_ = 0xc2b0c0a5;
                auVar116._16_4_ = 0xc2b0c0a5;
                auVar116._20_4_ = 0xc2b0c0a5;
                auVar116._24_4_ = 0xc2b0c0a5;
                auVar116._28_4_ = 0xc2b0c0a5;
                auVar169 = vmaxps_avx(auVar80,auVar116);
                auVar117._0_4_ = fVar84 + auVar169._0_4_ * 1.442695;
                auVar117._4_4_ = fVar85 + auVar169._4_4_ * 1.442695;
                auVar117._8_4_ = fVar86 + auVar169._8_4_ * 1.442695;
                auVar117._12_4_ = fVar87 + auVar169._12_4_ * 1.442695;
                auVar117._16_4_ = fVar88 + auVar169._16_4_ * 1.442695;
                auVar117._20_4_ = fVar89 + auVar169._20_4_ * 1.442695;
                auVar117._24_4_ = fVar185 + auVar169._24_4_ * 1.442695;
                auVar117._28_4_ = fVar186 + 1.442695;
                auVar119 = vroundps_avx(auVar117,1);
                auVar80 = vcmpps_avx(auVar117,auVar119,1);
                auVar80 = vandps_avx(auVar80,auVar138);
                auVar80 = vsubps_avx(auVar119,auVar80);
                fVar68 = auVar169._0_4_ + auVar80._0_4_ * -0.6931472;
                fVar83 = auVar169._4_4_ + auVar80._4_4_ * -0.6931472;
                fVar186 = auVar169._8_4_ + auVar80._8_4_ * -0.6931472;
                fVar187 = auVar169._12_4_ + auVar80._12_4_ * -0.6931472;
                fVar188 = auVar169._16_4_ + auVar80._16_4_ * -0.6931472;
                fVar189 = auVar169._20_4_ + auVar80._20_4_ * -0.6931472;
                fVar190 = auVar169._24_4_ + auVar80._24_4_ * -0.6931472;
                auVar90._0_4_ = (int)auVar80._0_4_;
                auVar90._4_4_ = (int)auVar80._4_4_;
                auVar90._8_4_ = (int)auVar80._8_4_;
                auVar90._12_4_ = (int)auVar80._12_4_;
                auVar118._16_4_ = (int)auVar80._16_4_;
                auVar118._0_16_ = auVar90;
                auVar118._20_4_ = (int)auVar80._20_4_;
                auVar118._24_4_ = (int)auVar80._24_4_;
                auVar118._28_4_ = (int)auVar80._28_4_;
                auVar154 = vpslld_avx(auVar90,0x17);
                auVar122 = vpslld_avx(auVar118._16_16_,0x17);
                auVar62._8_4_ = 0x3f800000;
                auVar62._0_8_ = 0x3f8000003f800000;
                auVar62._12_4_ = 0x3f800000;
                auVar122 = vpaddd_avx(auVar122,auVar62);
                auVar154 = vpaddd_avx(auVar154,auVar62);
                in_ZMM3 = ZEXT1664(auVar154);
                auVar82._0_4_ =
                     (fVar68 + fVar174 +
                     fVar68 * fVar68 *
                     (fVar84 + ((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                                 fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68)) *
                     auVar154._0_4_ + fVar174;
                auVar82._4_4_ =
                     (fVar83 + fVar176 +
                     fVar83 * fVar83 *
                     (fVar85 + ((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) *
                                 fVar83 + 0.041665796) * fVar83 + 0.16666666) * fVar83)) *
                     auVar154._4_4_ + fVar176;
                auVar82._8_4_ =
                     (fVar186 + fVar177 +
                     fVar186 * fVar186 *
                     (fVar86 + ((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452)
                                 * fVar186 + 0.041665796) * fVar186 + 0.16666666) * fVar186)) *
                     auVar154._8_4_ + fVar177;
                auVar82._12_4_ =
                     (fVar187 + fVar178 +
                     fVar187 * fVar187 *
                     (fVar87 + ((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452)
                                 * fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187)) *
                     auVar154._12_4_ + fVar178;
                auVar82._16_4_ =
                     (fVar188 + fVar179 +
                     fVar188 * fVar188 *
                     (fVar88 + ((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452)
                                 * fVar188 + 0.041665796) * fVar188 + 0.16666666) * fVar188)) *
                     auVar122._0_4_ + fVar179;
                auVar82._20_4_ =
                     (fVar189 + fVar180 +
                     fVar189 * fVar189 *
                     (fVar89 + ((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452)
                                 * fVar189 + 0.041665796) * fVar189 + 0.16666666) * fVar189)) *
                     auVar122._4_4_ + fVar180;
                auVar82._24_4_ =
                     (fVar190 + fVar181 +
                     fVar190 * fVar190 *
                     (fVar185 +
                     ((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                      + 0.041665796) * fVar190 + 0.16666666) * fVar190)) * auVar122._8_4_ + fVar181;
                auVar82._28_4_ = auVar169._28_4_ + -0.6931472 + fVar182 + -0.6931472 + fVar182;
                auVar169 = vrcpps_avx(auVar82);
                fVar174 = auVar169._0_4_;
                fVar176 = auVar169._4_4_;
                auVar18._4_4_ = auVar82._4_4_ * fVar176;
                auVar18._0_4_ = auVar82._0_4_ * fVar174;
                fVar177 = auVar169._8_4_;
                auVar18._8_4_ = auVar82._8_4_ * fVar177;
                fVar178 = auVar169._12_4_;
                auVar18._12_4_ = auVar82._12_4_ * fVar178;
                fVar179 = auVar169._16_4_;
                auVar18._16_4_ = auVar82._16_4_ * fVar179;
                fVar180 = auVar169._20_4_;
                auVar18._20_4_ = auVar82._20_4_ * fVar180;
                fVar181 = auVar169._24_4_;
                auVar18._24_4_ = auVar82._24_4_ * fVar181;
                auVar18._28_4_ = auVar82._28_4_;
                auVar138 = vsubps_avx(auVar138,auVar18);
                auVar80._0_4_ = fVar174 + fVar174 * auVar138._0_4_;
                auVar80._4_4_ = fVar176 + fVar176 * auVar138._4_4_;
                auVar80._8_4_ = fVar177 + fVar177 * auVar138._8_4_;
                auVar80._12_4_ = fVar178 + fVar178 * auVar138._12_4_;
                auVar80._16_4_ = fVar179 + fVar179 * auVar138._16_4_;
                auVar80._20_4_ = fVar180 + fVar180 * auVar138._20_4_;
                auVar80._24_4_ = fVar181 + fVar181 * auVar138._24_4_;
                auVar80._28_4_ = auVar169._28_4_ + auVar138._28_4_;
                break;
              case 5:
                auVar170._8_4_ = 0x42b0c0a5;
                auVar170._0_8_ = 0x42b0c0a542b0c0a5;
                auVar170._12_4_ = 0x42b0c0a5;
                auVar170._16_4_ = 0x42b0c0a5;
                auVar170._20_4_ = 0x42b0c0a5;
                auVar170._24_4_ = 0x42b0c0a5;
                auVar170._28_4_ = 0x42b0c0a5;
                auVar169 = vminps_avx(auVar170,auVar80);
                auVar172._8_4_ = 0xc2b0c0a5;
                auVar172._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar172._12_4_ = 0xc2b0c0a5;
                auVar172._16_4_ = 0xc2b0c0a5;
                auVar172._20_4_ = 0xc2b0c0a5;
                auVar172._24_4_ = 0xc2b0c0a5;
                auVar172._28_4_ = 0xc2b0c0a5;
                auVar119 = vmaxps_avx(auVar172,auVar169);
                auVar133._0_4_ = fVar84 + auVar119._0_4_ * 1.442695;
                auVar133._4_4_ = fVar85 + auVar119._4_4_ * 1.442695;
                auVar133._8_4_ = fVar86 + auVar119._8_4_ * 1.442695;
                auVar133._12_4_ = fVar87 + auVar119._12_4_ * 1.442695;
                auVar133._16_4_ = fVar88 + auVar119._16_4_ * 1.442695;
                auVar133._20_4_ = fVar89 + auVar119._20_4_ * 1.442695;
                auVar133._24_4_ = fVar185 + auVar119._24_4_ * 1.442695;
                auVar133._28_4_ = fVar186 + in_ZMM3._28_4_;
                auVar139 = vroundps_avx(auVar133,1);
                auVar169 = vcmpps_avx(auVar133,auVar139,1);
                auVar169 = vandps_avx(auVar169,auVar138);
                auVar169 = vsubps_avx(auVar139,auVar169);
                auVar15._4_4_ = auVar169._4_4_ * 0.6931472;
                auVar15._0_4_ = auVar169._0_4_ * 0.6931472;
                auVar15._8_4_ = auVar169._8_4_ * 0.6931472;
                auVar15._12_4_ = auVar169._12_4_ * 0.6931472;
                auVar15._16_4_ = auVar169._16_4_ * 0.6931472;
                auVar15._20_4_ = auVar169._20_4_ * 0.6931472;
                auVar15._24_4_ = auVar169._24_4_ * 0.6931472;
                auVar15._28_4_ = auVar139._28_4_;
                auVar119 = vsubps_avx(auVar119,auVar15);
                fVar187 = auVar119._0_4_;
                fVar188 = auVar119._4_4_;
                fVar189 = auVar119._8_4_;
                fVar190 = auVar119._12_4_;
                fVar191 = auVar119._16_4_;
                fVar192 = auVar119._20_4_;
                fVar152 = auVar119._24_4_;
                auVar121._0_4_ = (int)auVar169._0_4_;
                auVar121._4_4_ = (int)auVar169._4_4_;
                auVar121._8_4_ = (int)auVar169._8_4_;
                auVar121._12_4_ = (int)auVar169._12_4_;
                auVar134._16_4_ = (int)auVar169._16_4_;
                auVar134._0_16_ = auVar121;
                auVar134._20_4_ = (int)auVar169._20_4_;
                auVar134._24_4_ = (int)auVar169._24_4_;
                auVar134._28_4_ = (int)auVar169._28_4_;
                auVar154 = vpslld_avx(auVar121,0x17);
                auVar122 = vpslld_avx(auVar134._16_16_,0x17);
                auVar148._8_4_ = 0x3f800000;
                auVar148._0_8_ = 0x3f8000003f800000;
                auVar148._12_4_ = 0x3f800000;
                in_ZMM4 = ZEXT1664(auVar148);
                auVar122 = vpaddd_avx(auVar122,auVar148);
                auVar154 = vpaddd_avx(auVar154,auVar148);
                auVar157._0_4_ =
                     (fVar187 + fVar174 +
                     fVar187 * fVar187 *
                     (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) * fVar187
                       + 0.041665796) * fVar187 + 0.16666666) * fVar187 + fVar84)) * auVar154._0_4_
                     + fVar174;
                auVar157._4_4_ =
                     (fVar188 + fVar176 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + fVar85)) * auVar154._4_4_
                     + fVar176;
                auVar157._8_4_ =
                     (fVar189 + fVar177 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar86)) * auVar154._8_4_
                     + fVar177;
                auVar157._12_4_ =
                     (fVar190 + fVar178 +
                     fVar190 * fVar190 *
                     (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                       + 0.041665796) * fVar190 + 0.16666666) * fVar190 + fVar87)) * auVar154._12_4_
                     + fVar178;
                auVar157._16_4_ =
                     (fVar191 + fVar179 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + fVar88)) * auVar122._0_4_
                     + fVar179;
                auVar157._20_4_ =
                     (fVar192 + fVar180 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar89)) * auVar122._4_4_
                     + fVar180;
                auVar157._24_4_ =
                     (fVar152 + fVar181 +
                     fVar152 * fVar152 *
                     (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152
                       + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar185)) * auVar122._8_4_
                     + fVar181;
                auVar157._28_4_ = auVar119._28_4_ + fVar182 + auVar139._28_4_ + fVar182;
                auVar111._8_4_ = 0x800000;
                auVar111._0_8_ = 0x80000000800000;
                auVar111._12_4_ = 0x800000;
                auVar111._16_4_ = 0x800000;
                auVar111._20_4_ = 0x800000;
                auVar111._24_4_ = 0x800000;
                auVar111._28_4_ = 0x800000;
                auVar139 = vmaxps_avx(auVar157,auVar111);
                auVar122 = vpsrld_avx(auVar139._16_16_,0x17);
                auVar167._8_4_ = 0x807fffff;
                auVar167._0_8_ = 0x807fffff807fffff;
                auVar167._12_4_ = 0x807fffff;
                auVar167._16_4_ = 0x807fffff;
                auVar167._20_4_ = 0x807fffff;
                auVar167._24_4_ = 0x807fffff;
                auVar167._28_4_ = 0x807fffff;
                auVar169 = vandps_avx(auVar139,auVar167);
                auVar15 = vorps_avx(auVar169,auVar173._0_32_);
                auVar175._8_4_ = 0x3f3504f3;
                auVar175._0_8_ = 0x3f3504f33f3504f3;
                auVar175._12_4_ = 0x3f3504f3;
                auVar175._16_4_ = 0x3f3504f3;
                auVar175._20_4_ = 0x3f3504f3;
                auVar175._24_4_ = 0x3f3504f3;
                auVar175._28_4_ = 0x3f3504f3;
                auVar119 = vcmpps_avx(auVar175,auVar15,2);
                auVar169 = vandnps_avx(auVar119,auVar15);
                fVar187 = auVar169._0_4_ + auVar15._0_4_ + -1.0;
                fVar188 = auVar169._4_4_ + auVar15._4_4_ + -1.0;
                fVar189 = auVar169._8_4_ + auVar15._8_4_ + -1.0;
                fVar190 = auVar169._12_4_ + auVar15._12_4_ + -1.0;
                fVar191 = auVar169._16_4_ + auVar15._16_4_ + -1.0;
                fVar192 = auVar169._20_4_ + auVar15._20_4_ + -1.0;
                fVar152 = auVar169._24_4_ + auVar15._24_4_ + -1.0;
                auVar122 = vpsubd_avx(auVar122,auVar119._16_16_);
                auVar154 = vpsrld_avx(auVar139._0_16_,0x17);
                auVar159._8_4_ = 0xffffff81;
                auVar159._0_8_ = 0xffffff81ffffff81;
                auVar159._12_4_ = 0xffffff81;
                auVar122 = vpaddd_avx(auVar122,auVar159);
                auVar154 = vpsubd_avx(auVar154,auVar119._0_16_);
                auVar154 = vpaddd_avx(auVar154,auVar159);
                auVar112._16_16_ = auVar122;
                auVar112._0_16_ = auVar154;
                auVar119 = vcmpps_avx(auVar157,_DAT_00559600,2);
                auVar139 = vcvtdq2ps_avx(auVar112);
                auVar16._4_4_ =
                     (fVar188 + auVar139._4_4_ * 0.6931472 +
                     fVar188 * fVar188 *
                     (fVar188 * (fVar188 * (fVar188 * (fVar188 * (fVar188 * (fVar188 * (fVar188 * (
                                                  fVar188 * (fVar188 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._0_4_ =
                     (fVar187 + auVar139._0_4_ * 0.6931472 +
                     fVar187 * fVar187 *
                     (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (
                                                  fVar187 * (fVar187 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._8_4_ =
                     (fVar189 + auVar139._8_4_ * 0.6931472 +
                     fVar189 * fVar189 *
                     (fVar189 * (fVar189 * (fVar189 * (fVar189 * (fVar189 * (fVar189 * (fVar189 * (
                                                  fVar189 * (fVar189 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._12_4_ =
                     (fVar190 + auVar139._12_4_ * 0.6931472 +
                     fVar190 * fVar190 *
                     (fVar190 * (fVar190 * (fVar190 * (fVar190 * (fVar190 * (fVar190 * (fVar190 * (
                                                  fVar190 * (fVar190 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._16_4_ =
                     (fVar191 + auVar139._16_4_ * 0.6931472 +
                     fVar191 * fVar191 *
                     (fVar191 * (fVar191 * (fVar191 * (fVar191 * (fVar191 * (fVar191 * (fVar191 * (
                                                  fVar191 * (fVar191 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._20_4_ =
                     (fVar192 + auVar139._20_4_ * 0.6931472 +
                     fVar192 * fVar192 *
                     (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (
                                                  fVar192 * (fVar192 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._24_4_ =
                     (fVar152 + auVar139._24_4_ * 0.6931472 +
                     fVar152 * fVar152 *
                     (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (
                                                  fVar152 * (fVar152 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._28_4_ = auVar169._28_4_ + auVar15._28_4_ + -1.0 + auVar139._28_4_ + 0.0;
                auVar135._8_4_ = 0x7fffffff;
                auVar135._0_8_ = 0x7fffffff7fffffff;
                auVar135._12_4_ = 0x7fffffff;
                auVar135._16_4_ = 0x7fffffff;
                auVar135._20_4_ = 0x7fffffff;
                auVar135._24_4_ = 0x7fffffff;
                auVar135._28_4_ = 0x7fffffff;
                auVar169 = vblendvps_avx(auVar16,auVar135,auVar119);
                auVar136._8_4_ = 0x42b0c0a5;
                auVar136._0_8_ = 0x42b0c0a542b0c0a5;
                auVar136._12_4_ = 0x42b0c0a5;
                auVar136._16_4_ = 0x42b0c0a5;
                auVar136._20_4_ = 0x42b0c0a5;
                auVar136._24_4_ = 0x42b0c0a5;
                auVar136._28_4_ = 0x42b0c0a5;
                auVar169 = vminps_avx(auVar169,auVar136);
                auVar119 = vmaxps_avx(auVar172,auVar169);
                auVar137._0_4_ = auVar119._0_4_ * 1.442695 + fVar84;
                auVar137._4_4_ = auVar119._4_4_ * 1.442695 + fVar85;
                auVar137._8_4_ = auVar119._8_4_ * 1.442695 + fVar86;
                auVar137._12_4_ = auVar119._12_4_ * 1.442695 + fVar87;
                auVar137._16_4_ = auVar119._16_4_ * 1.442695 + fVar88;
                auVar137._20_4_ = auVar119._20_4_ * 1.442695 + fVar89;
                auVar137._24_4_ = auVar119._24_4_ * 1.442695 + fVar185;
                auVar137._28_4_ = fVar186 + 1.442695;
                auVar139 = vroundps_avx(auVar137,1);
                auVar169 = vcmpps_avx(auVar137,auVar139,1);
                auVar169 = vandps_avx(auVar169,auVar138);
                auVar169 = vsubps_avx(auVar139,auVar169);
                auVar17._4_4_ = auVar169._4_4_ * 0.6931472;
                auVar17._0_4_ = auVar169._0_4_ * 0.6931472;
                auVar17._8_4_ = auVar169._8_4_ * 0.6931472;
                auVar17._12_4_ = auVar169._12_4_ * 0.6931472;
                auVar17._16_4_ = auVar169._16_4_ * 0.6931472;
                auVar17._20_4_ = auVar169._20_4_ * 0.6931472;
                auVar17._24_4_ = auVar169._24_4_ * 0.6931472;
                auVar17._28_4_ = auVar139._28_4_;
                auVar171 = ZEXT864(0) << 0x20;
                auVar119 = vsubps_avx(auVar119,auVar17);
                fVar186 = auVar119._0_4_;
                fVar187 = auVar119._4_4_;
                fVar188 = auVar119._8_4_;
                fVar189 = auVar119._12_4_;
                fVar190 = auVar119._16_4_;
                fVar191 = auVar119._20_4_;
                fVar192 = auVar119._24_4_;
                auVar153 = ZEXT3264(auVar138);
                auVar173 = ZEXT3264(auVar173._0_32_);
                auVar123._0_4_ = (int)auVar169._0_4_;
                auVar123._4_4_ = (int)auVar169._4_4_;
                auVar123._8_4_ = (int)auVar169._8_4_;
                auVar123._12_4_ = (int)auVar169._12_4_;
                auVar138._16_4_ = (int)auVar169._16_4_;
                auVar138._0_16_ = auVar123;
                auVar138._20_4_ = (int)auVar169._20_4_;
                auVar138._24_4_ = (int)auVar169._24_4_;
                auVar138._28_4_ = (int)auVar169._28_4_;
                auVar154 = vpslld_avx(auVar123,0x17);
                auVar122 = vpslld_avx(auVar138._16_16_,0x17);
                auVar122 = vpaddd_avx(auVar122,auVar148);
                auVar154 = vpaddd_avx(auVar154,auVar148);
                auVar113._0_4_ =
                     (fVar186 + fVar174 +
                     fVar186 * fVar186 *
                     (fVar84 + ((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452)
                                 * fVar186 + 0.041665796) * fVar186 + 0.16666666) * fVar186)) *
                     auVar154._0_4_ + fVar174;
                auVar113._4_4_ =
                     (fVar187 + fVar176 +
                     fVar187 * fVar187 *
                     (fVar85 + ((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452)
                                 * fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187)) *
                     auVar154._4_4_ + fVar176;
                auVar113._8_4_ =
                     (fVar188 + fVar177 +
                     fVar188 * fVar188 *
                     (fVar86 + ((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452)
                                 * fVar188 + 0.041665796) * fVar188 + 0.16666666) * fVar188)) *
                     auVar154._8_4_ + fVar177;
                auVar113._12_4_ =
                     (fVar189 + fVar178 +
                     fVar189 * fVar189 *
                     (fVar87 + ((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452)
                                 * fVar189 + 0.041665796) * fVar189 + 0.16666666) * fVar189)) *
                     auVar154._12_4_ + fVar178;
                auVar113._16_4_ =
                     (fVar190 + fVar179 +
                     fVar190 * fVar190 *
                     (fVar88 + ((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452)
                                 * fVar190 + 0.041665796) * fVar190 + 0.16666666) * fVar190)) *
                     auVar122._0_4_ + fVar179;
                auVar113._20_4_ =
                     (fVar191 + fVar180 +
                     fVar191 * fVar191 *
                     (fVar89 + ((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452)
                                 * fVar191 + 0.041665796) * fVar191 + 0.16666666) * fVar191)) *
                     auVar122._4_4_ + fVar180;
                auVar113._24_4_ =
                     (fVar192 + fVar181 +
                     fVar192 * fVar192 *
                     (fVar185 +
                     ((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                      + 0.041665796) * fVar192 + 0.16666666) * fVar192)) * auVar122._8_4_ + fVar181;
                auVar113._28_4_ = auVar119._28_4_ + fVar182 + auVar139._28_4_ + fVar182;
                auVar138 = vrcpps_avx(auVar113);
                fVar174 = auVar138._0_4_;
                fVar176 = auVar138._4_4_;
                fVar177 = auVar138._8_4_;
                fVar178 = auVar138._12_4_;
                fVar179 = auVar138._16_4_;
                fVar180 = auVar138._20_4_;
                fVar181 = auVar138._24_4_;
                auVar169._4_4_ = auVar113._4_4_ * (fVar176 + fVar176);
                auVar169._0_4_ = auVar113._0_4_ * (fVar174 + fVar174);
                auVar169._8_4_ = auVar113._8_4_ * (fVar177 + fVar177);
                auVar169._12_4_ = auVar113._12_4_ * (fVar178 + fVar178);
                auVar169._16_4_ = auVar113._16_4_ * (fVar179 + fVar179);
                auVar169._20_4_ = auVar113._20_4_ * (fVar180 + fVar180);
                auVar169._24_4_ = auVar113._24_4_ * (fVar181 + fVar181);
                auVar169._28_4_ = auVar113._28_4_;
                auVar67._8_4_ = 0x40000000;
                auVar67._0_8_ = 0x4000000040000000;
                auVar67._12_4_ = 0x40000000;
                auVar67._16_4_ = 0x40000000;
                auVar67._20_4_ = 0x40000000;
                auVar67._24_4_ = 0x40000000;
                auVar67._28_4_ = 0x40000000;
                auVar169 = vsubps_avx(auVar67,auVar169);
                auVar139._0_4_ = fVar174 + fVar174 + -1.0;
                auVar139._4_4_ = fVar176 + fVar176 + -1.0;
                auVar139._8_4_ = fVar177 + fVar177 + -1.0;
                auVar139._12_4_ = fVar178 + fVar178 + -1.0;
                auVar139._16_4_ = fVar179 + fVar179 + -1.0;
                auVar139._20_4_ = fVar180 + fVar180 + -1.0;
                auVar139._24_4_ = fVar181 + fVar181 + -1.0;
                auVar139._28_4_ = auVar138._28_4_ + auVar138._28_4_ + -1.0;
                auVar110._0_4_ = auVar139._0_4_ + fVar174 * auVar169._0_4_;
                auVar110._4_4_ = auVar139._4_4_ + fVar176 * auVar169._4_4_;
                auVar110._8_4_ = auVar139._8_4_ + fVar177 * auVar169._8_4_;
                auVar110._12_4_ = auVar139._12_4_ + fVar178 * auVar169._12_4_;
                auVar110._16_4_ = auVar139._16_4_ + fVar179 * auVar169._16_4_;
                auVar110._20_4_ = auVar139._20_4_ + fVar180 * auVar169._20_4_;
                auVar110._24_4_ = auVar139._24_4_ + fVar181 * auVar169._24_4_;
                goto LAB_00503cb8;
              case 6:
                fVar174 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                fVar176 = (*(float **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar139._4_4_ = fVar176;
                auVar139._0_4_ = fVar176;
                auVar139._8_4_ = fVar176;
                auVar139._12_4_ = fVar176;
                auVar139._16_4_ = fVar176;
                auVar139._20_4_ = fVar176;
                auVar139._24_4_ = fVar176;
                auVar139._28_4_ = fVar176;
                auVar119._0_4_ = fVar174 * fVar68 + fVar176;
                auVar119._4_4_ = fVar174 * fVar83 + fVar176;
                auVar119._8_4_ = fVar174 * auVar80._8_4_ + fVar176;
                auVar119._12_4_ = fVar174 * auVar80._12_4_ + fVar176;
                auVar119._16_4_ = fVar174 * auVar80._16_4_ + fVar176;
                auVar119._20_4_ = fVar174 * auVar80._20_4_ + fVar176;
                auVar119._24_4_ = fVar174 * auVar80._24_4_ + fVar176;
                auVar119._28_4_ = fVar174 + fVar176;
                auVar169 = vmaxps_avx(auVar169,auVar119);
                auVar138 = vminps_avx(auVar169,auVar138);
                auVar110 = auVar138._0_28_;
LAB_00503cb8:
                in_ZMM3 = ZEXT3264(auVar139);
                auVar80._4_4_ = auVar110._4_4_ * fVar83;
                auVar80._0_4_ = auVar110._0_4_ * fVar68;
                auVar80._8_4_ = auVar110._8_4_ * auVar80._8_4_;
                auVar80._12_4_ = auVar110._12_4_ * auVar80._12_4_;
                auVar80._16_4_ = auVar110._16_4_ * auVar80._16_4_;
                auVar80._20_4_ = auVar110._20_4_ * auVar80._20_4_;
                auVar80._24_4_ = auVar110._24_4_ * auVar80._24_4_;
              }
              auVar154 = auVar80._16_16_;
              auVar122 = auVar80._0_16_;
              if (iVar53 == 1) {
                *(int *)*local_1d0 = auVar80._0_4_;
                uVar7 = vextractps_avx(auVar122,1);
                *(undefined4 *)((long)*local_1d0 + lVar57 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar122,2);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar56 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar122,3);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar56 * 3) * 4) = uVar7;
                *(int *)((long)*local_1d0 + (long)(iVar56 * 4) * 4) = auVar80._16_4_;
                uVar7 = vextractps_avx(auVar154,1);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar56 * 5) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar154,2);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar56 * 6) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar154,3);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar56 * 7) * 4) = uVar7;
                local_1d0 = (undefined1 (*) [32])((long)*local_1d0 + 4);
              }
              else if (iVar53 == 4) {
                *(undefined1 (*) [16])*local_1d0 = auVar122;
                *(undefined1 (*) [16])((long)*local_1d0 + lVar57 * 4) = auVar154;
                local_1d0 = (undefined1 (*) [32])((long)*local_1d0 + 0x10);
              }
              else if (iVar53 == 8) {
                *local_1d0 = auVar80;
                local_1d0 = local_1d0 + 1;
              }
              lVar31 = local_1a8._0_8_ + 1;
              iVar43 = iVar43 + iVar47 * local_c8.elempack;
              local_150 = local_150 + lVar29 * 4;
              local_118._0_8_ = local_118._0_8_ + lVar29 * 4;
              local_1a8._0_8_ = lVar31;
            } while (lVar31 != lVar30);
          }
          local_1f8 = local_1f8 + 1;
        } while (local_1f8 != uVar49);
      }
      iVar43 = iVar27 + uVar49 * -8;
      iVar53 = iVar43 + 3;
      if (-1 < iVar43) {
        iVar53 = iVar43;
      }
      if (3 < iVar43) {
        auVar153 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar155._8_4_ = 0x3f800000;
        auVar155._0_8_ = 0x3f8000003f800000;
        auVar155._12_4_ = 0x3f800000;
        local_170 = 0;
        do {
          lVar57 = (long)top_blob->w;
          if (0 < lVar57) {
            uVar25 = local_c8.h * local_c8.elempack;
            iVar43 = top_blob->elempack;
            uVar32 = (long)(int)(uVar49 * 8) + local_170 * 4;
            uVar51 = (uint)uVar32;
            local_188 = (undefined1 (*) [16])
                        ((int)((long)((ulong)(uint)((int)uVar51 >> 0x1f) << 0x20 |
                                     uVar32 & 0xffffffff) / (long)iVar43) * lVar57 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar50 = uVar51 + 7;
            if (-1 < (int)uVar51) {
              uVar50 = uVar51;
            }
            auVar20._8_8_ = 0;
            auVar20._0_8_ = local_118._8_8_;
            local_118 = auVar20 << 0x40;
            iVar42 = 0;
            lVar30 = 0;
            local_150 = lVar59 * 4;
            do {
              auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar174 = 0.0;
              fVar176 = 0.0;
              fVar177 = 0.0;
              fVar178 = 0.0;
              if (lVar9 != 0) {
                pfVar48 = (float *)(lVar9 + uVar32 * 4);
                fVar174 = *pfVar48;
                fVar176 = pfVar48[1];
                fVar177 = pfVar48[2];
                fVar178 = pfVar48[3];
              }
              pfVar48 = (float *)((this->weight_data_tm).cstep *
                                  (long)(((int)(uVar51 - (uVar50 & 0xfffffff8)) >> 2) +
                                        ((int)uVar50 >> 3)) * (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar25 < 8) {
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar68 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                uVar26 = 0;
              }
              else {
                fVar68 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                iVar41 = 0;
                do {
                  lVar31 = (long)(iVar41 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar31 + (long)iVar42 * 4);
                      iVar44 = iVar5;
                      do {
                        fVar86 = *pfVar54;
                        fVar87 = pfVar54[1];
                        fVar88 = pfVar54[2];
                        fVar89 = pfVar54[3];
                        fVar185 = pfVar54[4];
                        fVar174 = fVar185 * pfVar48[0x10] + fVar86 * *pfVar48 + fVar174;
                        fVar176 = fVar185 * pfVar48[0x11] + fVar86 * pfVar48[1] + fVar176;
                        fVar177 = fVar185 * pfVar48[0x12] + fVar86 * pfVar48[2] + fVar177;
                        fVar178 = fVar185 * pfVar48[0x13] + fVar86 * pfVar48[3] + fVar178;
                        fVar86 = pfVar54[5];
                        fVar68 = fVar86 * pfVar48[0x14] + fVar68 + fVar87 * pfVar48[4];
                        fVar83 = fVar86 * pfVar48[0x15] + fVar83 + fVar87 * pfVar48[5];
                        fVar84 = fVar86 * pfVar48[0x16] + fVar84 + fVar87 * pfVar48[6];
                        fVar85 = fVar86 * pfVar48[0x17] + fVar85 + fVar87 * pfVar48[7];
                        fVar86 = pfVar54[6];
                        fVar179 = fVar88 * pfVar48[8] + fVar179 + fVar86 * pfVar48[0x18];
                        fVar180 = fVar88 * pfVar48[9] + fVar180 + fVar86 * pfVar48[0x19];
                        fVar181 = fVar88 * pfVar48[10] + fVar181 + fVar86 * pfVar48[0x1a];
                        fVar182 = fVar88 * pfVar48[0xb] + fVar182 + fVar86 * pfVar48[0x1b];
                        fVar86 = pfVar54[7];
                        auVar171 = ZEXT1664(CONCAT412(fVar89 * pfVar48[0xf] + auVar171._12_4_ +
                                                      fVar86 * pfVar48[0x1f],
                                                      CONCAT48(fVar89 * pfVar48[0xe] +
                                                               auVar171._8_4_ +
                                                               fVar86 * pfVar48[0x1e],
                                                               CONCAT44(fVar89 * pfVar48[0xd] +
                                                                        auVar171._4_4_ +
                                                                        fVar86 * pfVar48[0x1d],
                                                                        fVar89 * pfVar48[0xc] +
                                                                        auVar171._0_4_ +
                                                                        fVar86 * pfVar48[0x1c]))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar54 = pfVar54 + iVar6 * 8;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                      goto LAB_005041a9;
                    }
                  }
                  else {
                    pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar31 + (long)(local_c8.elempack * iVar47 * (int)lVar30) * 4
                                       );
LAB_005041a9:
                    if (local_c8.elempack == 4) {
                      iVar44 = iVar5;
                      if (iVar5 < 1) goto LAB_005042fc;
                      do {
                        fVar86 = *pfVar54;
                        fVar87 = pfVar54[1];
                        fVar88 = pfVar54[2];
                        fVar89 = pfVar54[3];
                        fVar185 = pfVar54[lVar59];
                        fVar174 = fVar185 * pfVar48[0x10] + fVar86 * *pfVar48 + fVar174;
                        fVar176 = fVar185 * pfVar48[0x11] + fVar86 * pfVar48[1] + fVar176;
                        fVar177 = fVar185 * pfVar48[0x12] + fVar86 * pfVar48[2] + fVar177;
                        fVar178 = fVar185 * pfVar48[0x13] + fVar86 * pfVar48[3] + fVar178;
                        fVar86 = pfVar54[lVar59 + 1];
                        fVar68 = fVar86 * pfVar48[0x14] + fVar68 + fVar87 * pfVar48[4];
                        fVar83 = fVar86 * pfVar48[0x15] + fVar83 + fVar87 * pfVar48[5];
                        fVar84 = fVar86 * pfVar48[0x16] + fVar84 + fVar87 * pfVar48[6];
                        fVar85 = fVar86 * pfVar48[0x17] + fVar85 + fVar87 * pfVar48[7];
                        fVar86 = pfVar54[lVar59 + 2];
                        fVar179 = fVar88 * pfVar48[8] + fVar179 + fVar86 * pfVar48[0x18];
                        fVar180 = fVar88 * pfVar48[9] + fVar180 + fVar86 * pfVar48[0x19];
                        fVar181 = fVar88 * pfVar48[10] + fVar181 + fVar86 * pfVar48[0x1a];
                        fVar182 = fVar88 * pfVar48[0xb] + fVar182 + fVar86 * pfVar48[0x1b];
                        fVar86 = pfVar54[lVar59 + 3];
                        auVar171 = ZEXT1664(CONCAT412(fVar89 * pfVar48[0xf] + auVar171._12_4_ +
                                                      fVar86 * pfVar48[0x1f],
                                                      CONCAT48(fVar89 * pfVar48[0xe] +
                                                               auVar171._8_4_ +
                                                               fVar86 * pfVar48[0x1e],
                                                               CONCAT44(fVar89 * pfVar48[0xd] +
                                                                        auVar171._4_4_ +
                                                                        fVar86 * pfVar48[0x1d],
                                                                        fVar89 * pfVar48[0xc] +
                                                                        auVar171._0_4_ +
                                                                        fVar86 * pfVar48[0x1c]))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar54 = pfVar54 + iVar6 * 4;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar44 = iVar5, 0 < iVar5)) {
                      do {
                        fVar86 = *pfVar54;
                        fVar87 = pfVar54[lVar59];
                        fVar88 = pfVar54[iVar24 * 2];
                        fVar89 = pfVar54[iVar24 * 3];
                        fVar185 = pfVar54[iVar24 * 4];
                        fVar174 = fVar185 * pfVar48[0x10] + fVar86 * *pfVar48 + fVar174;
                        fVar176 = fVar185 * pfVar48[0x11] + fVar86 * pfVar48[1] + fVar176;
                        fVar177 = fVar185 * pfVar48[0x12] + fVar86 * pfVar48[2] + fVar177;
                        fVar178 = fVar185 * pfVar48[0x13] + fVar86 * pfVar48[3] + fVar178;
                        fVar86 = pfVar54[iVar24 * 5];
                        fVar68 = fVar86 * pfVar48[0x14] + fVar68 + fVar87 * pfVar48[4];
                        fVar83 = fVar86 * pfVar48[0x15] + fVar83 + fVar87 * pfVar48[5];
                        fVar84 = fVar86 * pfVar48[0x16] + fVar84 + fVar87 * pfVar48[6];
                        fVar85 = fVar86 * pfVar48[0x17] + fVar85 + fVar87 * pfVar48[7];
                        fVar86 = pfVar54[iVar24 * 6];
                        fVar179 = fVar88 * pfVar48[8] + fVar179 + fVar86 * pfVar48[0x18];
                        fVar180 = fVar88 * pfVar48[9] + fVar180 + fVar86 * pfVar48[0x19];
                        fVar181 = fVar88 * pfVar48[10] + fVar181 + fVar86 * pfVar48[0x1a];
                        fVar182 = fVar88 * pfVar48[0xb] + fVar182 + fVar86 * pfVar48[0x1b];
                        fVar86 = pfVar54[iVar24 * 7];
                        auVar171 = ZEXT1664(CONCAT412(fVar89 * pfVar48[0xf] + auVar171._12_4_ +
                                                      fVar86 * pfVar48[0x1f],
                                                      CONCAT48(fVar89 * pfVar48[0xe] +
                                                               auVar171._8_4_ +
                                                               fVar86 * pfVar48[0x1e],
                                                               CONCAT44(fVar89 * pfVar48[0xd] +
                                                                        auVar171._4_4_ +
                                                                        fVar86 * pfVar48[0x1d],
                                                                        fVar89 * pfVar48[0xc] +
                                                                        auVar171._0_4_ +
                                                                        fVar86 * pfVar48[0x1c]))));
                        pfVar48 = pfVar48 + 0x20;
                        pfVar54 = pfVar54 + lVar28;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                    }
                  }
LAB_005042fc:
                  iVar44 = iVar41 + 0xf;
                  uVar26 = uVar25 & 0xfffffff8;
                  iVar41 = iVar41 + 8;
                } while (iVar44 < (int)uVar25);
              }
              auVar122 = auVar171._0_16_;
              if ((int)(uVar26 | 3) < (int)uVar25) {
                uVar52 = uVar26;
                do {
                  lVar31 = (long)((int)uVar52 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                         lVar31 + (long)iVar42 * 4);
                      iVar41 = iVar5;
                      do {
                        fVar86 = *pfVar54;
                        fVar174 = fVar86 * *pfVar48 + fVar174;
                        fVar176 = fVar86 * pfVar48[1] + fVar176;
                        fVar177 = fVar86 * pfVar48[2] + fVar177;
                        fVar178 = fVar86 * pfVar48[3] + fVar178;
                        fVar86 = pfVar54[1];
                        fVar68 = fVar68 + fVar86 * pfVar48[4];
                        fVar83 = fVar83 + fVar86 * pfVar48[5];
                        fVar84 = fVar84 + fVar86 * pfVar48[6];
                        fVar85 = fVar85 + fVar86 * pfVar48[7];
                        fVar86 = pfVar54[2];
                        fVar179 = fVar179 + fVar86 * pfVar48[8];
                        fVar180 = fVar180 + fVar86 * pfVar48[9];
                        fVar181 = fVar181 + fVar86 * pfVar48[10];
                        fVar182 = fVar182 + fVar86 * pfVar48[0xb];
                        fVar86 = pfVar54[3];
                        auVar171 = ZEXT1664(CONCAT412(fVar86 * pfVar48[0xf] + auVar171._12_4_,
                                                      CONCAT48(fVar86 * pfVar48[0xe] +
                                                               auVar171._8_4_,
                                                               CONCAT44(fVar86 * pfVar48[0xd] +
                                                                        auVar171._4_4_,
                                                                        fVar86 * pfVar48[0xc] +
                                                                        auVar171._0_4_))));
                        pfVar48 = pfVar48 + 0x10;
                        pfVar54 = pfVar54 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_005043d7;
                    }
                  }
                  else {
                    pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                       lVar31 + (long)(local_c8.elempack * iVar47 * (int)lVar30) * 4
                                       );
LAB_005043d7:
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        fVar86 = *pfVar54;
                        fVar174 = fVar86 * *pfVar48 + fVar174;
                        fVar176 = fVar86 * pfVar48[1] + fVar176;
                        fVar177 = fVar86 * pfVar48[2] + fVar177;
                        fVar178 = fVar86 * pfVar48[3] + fVar178;
                        fVar86 = pfVar54[lVar59];
                        fVar68 = fVar68 + fVar86 * pfVar48[4];
                        fVar83 = fVar83 + fVar86 * pfVar48[5];
                        fVar84 = fVar84 + fVar86 * pfVar48[6];
                        fVar85 = fVar85 + fVar86 * pfVar48[7];
                        fVar86 = pfVar54[iVar24 * 2];
                        fVar179 = fVar179 + fVar86 * pfVar48[8];
                        fVar180 = fVar180 + fVar86 * pfVar48[9];
                        fVar181 = fVar181 + fVar86 * pfVar48[10];
                        fVar182 = fVar182 + fVar86 * pfVar48[0xb];
                        fVar86 = pfVar54[iVar24 * 3];
                        auVar171 = ZEXT1664(CONCAT412(fVar86 * pfVar48[0xf] + auVar171._12_4_,
                                                      CONCAT48(fVar86 * pfVar48[0xe] +
                                                               auVar171._8_4_,
                                                               CONCAT44(fVar86 * pfVar48[0xd] +
                                                                        auVar171._4_4_,
                                                                        fVar86 * pfVar48[0xc] +
                                                                        auVar171._0_4_))));
                        pfVar48 = pfVar48 + 0x10;
                        pfVar54 = pfVar54 + lVar28;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
                  auVar122 = auVar171._0_16_;
                  uVar26 = uVar52 + 4;
                  iVar41 = uVar52 + 7;
                  uVar52 = uVar26;
                } while (iVar41 < (int)uVar25);
              }
              uVar33 = (ulong)uVar26;
              if ((int)(uVar26 | 1) < (int)uVar25) {
                lVar38 = (long)local_c8.w * local_c8.elemsize * uVar33;
                lVar60 = (long)(_func_int ***)local_c8.data + lVar38 + local_150;
                lVar31 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar38 = (long)(_func_int ***)local_c8.data + lVar38 + local_118._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar39 = 0;
                    iVar41 = iVar5;
                    do {
                      fVar86 = *(float *)(lVar38 + lVar39);
                      fVar174 = fVar86 * *pfVar48 + fVar174;
                      fVar176 = fVar86 * pfVar48[1] + fVar176;
                      fVar177 = fVar86 * pfVar48[2] + fVar177;
                      fVar178 = fVar86 * pfVar48[3] + fVar178;
                      fVar86 = *(float *)(lVar60 + lVar39);
                      fVar68 = fVar68 + fVar86 * pfVar48[4];
                      fVar83 = fVar83 + fVar86 * pfVar48[5];
                      fVar84 = fVar84 + fVar86 * pfVar48[6];
                      fVar85 = fVar85 + fVar86 * pfVar48[7];
                      pfVar48 = pfVar48 + 8;
                      lVar39 = lVar39 + lVar28 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  uVar33 = uVar33 + 2;
                  uVar26 = (uint)uVar33;
                  lVar60 = lVar60 + lVar31;
                  lVar38 = lVar38 + lVar31;
                } while ((int)(uVar26 | 1) < (int)uVar25);
              }
              if ((int)uVar26 < (int)uVar25) {
                uVar33 = (ulong)uVar26;
                pfVar54 = (float *)((long)(_func_int ***)local_c8.data +
                                   (long)local_c8.w * local_c8.elemsize * uVar33 + local_118._0_8_);
                do {
                  pfVar35 = pfVar54;
                  iVar41 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar86 = *pfVar35;
                      fVar174 = fVar86 * *pfVar48 + fVar174;
                      fVar176 = fVar86 * pfVar48[1] + fVar176;
                      fVar177 = fVar86 * pfVar48[2] + fVar177;
                      fVar178 = fVar86 * pfVar48[3] + fVar178;
                      pfVar48 = pfVar48 + 4;
                      pfVar35 = pfVar35 + lVar28;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  uVar33 = uVar33 + 1;
                  pfVar54 = (float *)((long)pfVar54 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar33 < (int)uVar25);
              }
              auVar69._0_4_ = fVar179 + auVar122._0_4_ + fVar68 + fVar174;
              auVar69._4_4_ = fVar180 + auVar122._4_4_ + fVar83 + fVar176;
              auVar69._8_4_ = fVar181 + auVar122._8_4_ + fVar84 + fVar177;
              auVar69._12_4_ = fVar182 + auVar122._12_4_ + fVar85 + fVar178;
              fVar174 = auVar153._0_4_;
              fVar176 = auVar153._4_4_;
              fVar177 = auVar153._8_4_;
              fVar178 = auVar153._12_4_;
              switch(uVar37) {
              case 1:
                auVar69 = vmaxps_avx(auVar69,_DAT_00554060);
                break;
              case 2:
                auVar122 = vmaxps_avx(auVar69,ZEXT816(0) << 0x40);
                auVar154 = vminps_avx(auVar69,ZEXT816(0) << 0x40);
                fVar174 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                auVar69._0_4_ = fVar174 * auVar154._0_4_ + auVar122._0_4_;
                auVar69._4_4_ = fVar174 * auVar154._4_4_ + auVar122._4_4_;
                auVar69._8_4_ = fVar174 * auVar154._8_4_ + auVar122._8_4_;
                auVar69._12_4_ = fVar174 * auVar154._12_4_ + auVar122._12_4_;
                break;
              case 3:
                uVar7 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var8);
                auVar96._4_4_ = uVar7;
                auVar96._0_4_ = uVar7;
                auVar96._8_4_ = uVar7;
                auVar96._12_4_ = uVar7;
                uVar7 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar165._4_4_ = uVar7;
                auVar165._0_4_ = uVar7;
                auVar165._8_4_ = uVar7;
                auVar165._12_4_ = uVar7;
                auVar122 = vmaxps_avx(auVar69,auVar96);
                auVar69 = vminps_avx(auVar122,auVar165);
                break;
              case 4:
                uVar33 = CONCAT44(auVar69._4_4_,auVar69._0_4_);
                auVar70._0_8_ = uVar33 ^ 0x8000000080000000;
                auVar70._8_4_ = -auVar69._8_4_;
                auVar70._12_4_ = -auVar69._12_4_;
                auVar97._8_4_ = 0x42b0c0a5;
                auVar97._0_8_ = 0x42b0c0a542b0c0a5;
                auVar97._12_4_ = 0x42b0c0a5;
                auVar122 = vminps_avx(auVar70,auVar97);
                auVar98._8_4_ = 0xc2b0c0a5;
                auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar98._12_4_ = 0xc2b0c0a5;
                auVar121 = vmaxps_avx(auVar122,auVar98);
                auVar99._0_4_ = fVar174 + auVar121._0_4_ * 1.442695;
                auVar99._4_4_ = fVar176 + auVar121._4_4_ * 1.442695;
                auVar99._8_4_ = fVar177 + auVar121._8_4_ * 1.442695;
                auVar99._12_4_ = fVar178 + auVar121._12_4_ * 1.442695;
                auVar166._0_4_ = (int)auVar99._0_4_;
                auVar166._4_4_ = (int)auVar99._4_4_;
                auVar166._8_4_ = (int)auVar99._8_4_;
                auVar166._12_4_ = (int)auVar99._12_4_;
                auVar154 = vcvtdq2ps_avx(auVar166);
                auVar122 = vcmpps_avx(auVar99,auVar154,1);
                auVar122 = vandps_avx(auVar122,auVar155);
                auVar122 = vsubps_avx(auVar154,auVar122);
                fVar179 = auVar121._0_4_ + auVar122._0_4_ * -0.6931472;
                fVar180 = auVar121._4_4_ + auVar122._4_4_ * -0.6931472;
                fVar181 = auVar121._8_4_ + auVar122._8_4_ * -0.6931472;
                fVar182 = auVar121._12_4_ + auVar122._12_4_ * -0.6931472;
                auVar100._0_4_ = (int)auVar122._0_4_;
                auVar100._4_4_ = (int)auVar122._4_4_;
                auVar100._8_4_ = (int)auVar122._8_4_;
                auVar100._12_4_ = (int)auVar122._12_4_;
                auVar122 = vpslld_avx(auVar100,0x17);
                auVar122 = vpaddd_avx(auVar122,auVar155);
                auVar71._0_4_ =
                     (fVar179 + 1.0 +
                     (((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452) * fVar179
                       + 0.041665796) * fVar179 + 0.16666666) * fVar179 + fVar174) *
                     fVar179 * fVar179) * auVar122._0_4_ + 1.0;
                auVar71._4_4_ =
                     (fVar180 + 1.0 +
                     (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                       + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar176) *
                     fVar180 * fVar180) * auVar122._4_4_ + 1.0;
                auVar71._8_4_ =
                     (fVar181 + 1.0 +
                     (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) * fVar181
                       + 0.041665796) * fVar181 + 0.16666666) * fVar181 + fVar177) *
                     fVar181 * fVar181) * auVar122._8_4_ + 1.0;
                auVar71._12_4_ =
                     (fVar182 + 1.0 +
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar178) *
                     fVar182 * fVar182) * auVar122._12_4_ + 1.0;
                auVar122 = vrcpps_avx(auVar71);
                fVar174 = auVar122._0_4_;
                auVar72._0_4_ = auVar71._0_4_ * fVar174;
                fVar176 = auVar122._4_4_;
                auVar72._4_4_ = auVar71._4_4_ * fVar176;
                fVar177 = auVar122._8_4_;
                auVar72._8_4_ = auVar71._8_4_ * fVar177;
                fVar178 = auVar122._12_4_;
                auVar72._12_4_ = auVar71._12_4_ * fVar178;
                auVar122 = vsubps_avx(auVar155,auVar72);
                auVar69._0_4_ = fVar174 + fVar174 * auVar122._0_4_;
                auVar69._4_4_ = fVar176 + fVar176 * auVar122._4_4_;
                auVar69._8_4_ = fVar177 + fVar177 * auVar122._8_4_;
                auVar69._12_4_ = fVar178 + fVar178 * auVar122._12_4_;
                break;
              case 5:
                auVar149._8_4_ = 0x42b0c0a5;
                auVar149._0_8_ = 0x42b0c0a542b0c0a5;
                auVar149._12_4_ = 0x42b0c0a5;
                auVar122 = vminps_avx(auVar69,auVar149);
                auVar168._8_4_ = 0xc2b0c0a5;
                auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar168._12_4_ = 0xc2b0c0a5;
                auVar121 = vmaxps_avx(auVar168,auVar122);
                auVar160._0_4_ = fVar174 + auVar121._0_4_ * 1.442695;
                auVar160._4_4_ = fVar176 + auVar121._4_4_ * 1.442695;
                auVar160._8_4_ = fVar177 + auVar121._8_4_ * 1.442695;
                auVar160._12_4_ = fVar178 + auVar121._12_4_ * 1.442695;
                auVar183._0_4_ = (int)auVar160._0_4_;
                auVar183._4_4_ = (int)auVar160._4_4_;
                auVar183._8_4_ = (int)auVar160._8_4_;
                auVar183._12_4_ = (int)auVar160._12_4_;
                auVar154 = vcvtdq2ps_avx(auVar183);
                auVar122 = vcmpps_avx(auVar160,auVar154,1);
                auVar122 = vandps_avx(auVar122,auVar155);
                auVar122 = vsubps_avx(auVar154,auVar122);
                auVar184._0_4_ = auVar122._0_4_ * 0.6931472;
                auVar184._4_4_ = auVar122._4_4_ * 0.6931472;
                auVar184._8_4_ = auVar122._8_4_ * 0.6931472;
                auVar184._12_4_ = auVar122._12_4_ * 0.6931472;
                auVar154 = vsubps_avx(auVar121,auVar184);
                fVar179 = auVar154._0_4_;
                fVar180 = auVar154._4_4_;
                fVar181 = auVar154._8_4_;
                fVar182 = auVar154._12_4_;
                auVar161._0_4_ = (int)auVar122._0_4_;
                auVar161._4_4_ = (int)auVar122._4_4_;
                auVar161._8_4_ = (int)auVar122._8_4_;
                auVar161._12_4_ = (int)auVar122._12_4_;
                auVar122 = vpslld_avx(auVar161,0x17);
                auVar122 = vpaddd_avx(auVar122,auVar155);
                auVar162._0_4_ =
                     (fVar179 * fVar179 *
                      (((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452) *
                         fVar179 + 0.041665796) * fVar179 + 0.16666666) * fVar179 + fVar174) +
                     fVar179 + 1.0) * auVar122._0_4_ + 1.0;
                auVar162._4_4_ =
                     (fVar180 * fVar180 *
                      (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) *
                         fVar180 + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar176) +
                     fVar180 + 1.0) * auVar122._4_4_ + 1.0;
                auVar162._8_4_ =
                     (fVar181 * fVar181 *
                      (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) *
                         fVar181 + 0.041665796) * fVar181 + 0.16666666) * fVar181 + fVar177) +
                     fVar181 + 1.0) * auVar122._8_4_ + 1.0;
                auVar162._12_4_ =
                     (fVar182 * fVar182 *
                      (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) *
                         fVar182 + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar178) +
                     fVar182 + 1.0) * auVar122._12_4_ + 1.0;
                auVar91._8_4_ = 0x800000;
                auVar91._0_8_ = 0x80000000800000;
                auVar91._12_4_ = 0x800000;
                auVar122 = vmaxps_avx(auVar162,auVar91);
                auVar154 = vpsrld_avx(auVar122,0x17);
                auVar124._8_4_ = 0xffffff82;
                auVar124._0_8_ = 0xffffff82ffffff82;
                auVar124._12_4_ = 0xffffff82;
                auVar154 = vpaddd_avx(auVar154,auVar124);
                auVar125._8_4_ = 0x807fffff;
                auVar125._0_8_ = 0x807fffff807fffff;
                auVar125._12_4_ = 0x807fffff;
                auVar122 = vandps_avx(auVar122,auVar125);
                auVar123 = vorps_avx(auVar122,auVar153._0_16_);
                auVar121 = vcvtdq2ps_avx(auVar154);
                auVar126._8_4_ = 0x3f3504f3;
                auVar126._0_8_ = 0x3f3504f33f3504f3;
                auVar126._12_4_ = 0x3f3504f3;
                auVar154 = vcmpps_avx(auVar123,auVar126,1);
                auVar122 = vandps_avx(auVar154,auVar123);
                fVar179 = auVar123._0_4_ + -1.0 + auVar122._0_4_;
                fVar180 = auVar123._4_4_ + -1.0 + auVar122._4_4_;
                fVar181 = auVar123._8_4_ + -1.0 + auVar122._8_4_;
                fVar182 = auVar123._12_4_ + -1.0 + auVar122._12_4_;
                auVar122 = vandps_avx(auVar154,auVar155);
                auVar154 = vsubps_avx(auVar121,auVar122);
                auVar122 = vcmpps_avx(auVar162,_DAT_00554060,2);
                auVar92._0_4_ =
                     (fVar179 * fVar179 *
                      (((((((((fVar179 * 0.070376836 + -0.1151461) * fVar179 + 0.116769984) *
                             fVar179 + -0.12420141) * fVar179 + 0.14249323) * fVar179 + -0.16668057)
                          * fVar179 + 0.20000714) * fVar179 + -0.24999994) * fVar179 + 0.3333333) *
                       fVar179 + -0.5) + auVar154._0_4_ * 0.6931472 + fVar179) * -2.0;
                auVar92._4_4_ =
                     (fVar180 * fVar180 *
                      (((((((((fVar180 * 0.070376836 + -0.1151461) * fVar180 + 0.116769984) *
                             fVar180 + -0.12420141) * fVar180 + 0.14249323) * fVar180 + -0.16668057)
                          * fVar180 + 0.20000714) * fVar180 + -0.24999994) * fVar180 + 0.3333333) *
                       fVar180 + -0.5) + auVar154._4_4_ * 0.6931472 + fVar180) * -2.0;
                auVar92._8_4_ =
                     (fVar181 * fVar181 *
                      (((((((((fVar181 * 0.070376836 + -0.1151461) * fVar181 + 0.116769984) *
                             fVar181 + -0.12420141) * fVar181 + 0.14249323) * fVar181 + -0.16668057)
                          * fVar181 + 0.20000714) * fVar181 + -0.24999994) * fVar181 + 0.3333333) *
                       fVar181 + -0.5) + auVar154._8_4_ * 0.6931472 + fVar181) * -2.0;
                auVar92._12_4_ =
                     (fVar182 * fVar182 *
                      (((((((((fVar182 * 0.070376836 + -0.1151461) * fVar182 + 0.116769984) *
                             fVar182 + -0.12420141) * fVar182 + 0.14249323) * fVar182 + -0.16668057)
                          * fVar182 + 0.20000714) * fVar182 + -0.24999994) * fVar182 + 0.3333333) *
                       fVar182 + -0.5) + auVar154._12_4_ * 0.6931472 + fVar182) * -2.0;
                auVar127._8_4_ = 0x7fffffff;
                auVar127._0_8_ = 0x7fffffff7fffffff;
                auVar127._12_4_ = 0x7fffffff;
                auVar122 = vblendvps_avx(auVar92,auVar127,auVar122);
                auVar128._8_4_ = 0x42b0c0a5;
                auVar128._0_8_ = 0x42b0c0a542b0c0a5;
                auVar128._12_4_ = 0x42b0c0a5;
                auVar122 = vminps_avx(auVar122,auVar128);
                auVar129._8_4_ = 0xc2b0c0a5;
                auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar129._12_4_ = 0xc2b0c0a5;
                auVar121 = vmaxps_avx(auVar122,auVar129);
                auVar130._0_4_ = auVar121._0_4_ * 1.442695 + fVar174;
                auVar130._4_4_ = auVar121._4_4_ * 1.442695 + fVar176;
                auVar130._8_4_ = auVar121._8_4_ * 1.442695 + fVar177;
                auVar130._12_4_ = auVar121._12_4_ * 1.442695 + fVar178;
                auVar163._0_4_ = (int)auVar130._0_4_;
                auVar163._4_4_ = (int)auVar130._4_4_;
                auVar163._8_4_ = (int)auVar130._8_4_;
                auVar163._12_4_ = (int)auVar130._12_4_;
                auVar154 = vcvtdq2ps_avx(auVar163);
                auVar122 = vcmpps_avx(auVar130,auVar154,1);
                auVar122 = vandps_avx(auVar122,auVar155);
                auVar122 = vsubps_avx(auVar154,auVar122);
                auVar164._0_4_ = auVar122._0_4_ * 0.6931472;
                auVar164._4_4_ = auVar122._4_4_ * 0.6931472;
                auVar164._8_4_ = auVar122._8_4_ * 0.6931472;
                auVar164._12_4_ = auVar122._12_4_ * 0.6931472;
                auVar154 = vsubps_avx(auVar121,auVar164);
                fVar179 = auVar154._0_4_;
                fVar180 = auVar154._4_4_;
                fVar181 = auVar154._8_4_;
                fVar182 = auVar154._12_4_;
                auVar153 = ZEXT1664(auVar153._0_16_);
                auVar131._0_4_ = (int)auVar122._0_4_;
                auVar131._4_4_ = (int)auVar122._4_4_;
                auVar131._8_4_ = (int)auVar122._8_4_;
                auVar131._12_4_ = (int)auVar122._12_4_;
                auVar122 = vpslld_avx(auVar131,0x17);
                auVar122 = vpaddd_avx(auVar122,auVar155);
                auVar93._0_4_ =
                     (fVar179 + 1.0 +
                     (((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452) * fVar179
                       + 0.041665796) * fVar179 + 0.16666666) * fVar179 + fVar174) *
                     fVar179 * fVar179) * auVar122._0_4_ + 1.0;
                auVar93._4_4_ =
                     (fVar180 + 1.0 +
                     (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                       + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar176) *
                     fVar180 * fVar180) * auVar122._4_4_ + 1.0;
                auVar93._8_4_ =
                     (fVar181 + 1.0 +
                     (((((fVar181 * 0.00019875691 + 0.0013981999) * fVar181 + 0.008333452) * fVar181
                       + 0.041665796) * fVar181 + 0.16666666) * fVar181 + fVar177) *
                     fVar181 * fVar181) * auVar122._8_4_ + 1.0;
                auVar93._12_4_ =
                     (fVar182 + 1.0 +
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar178) *
                     fVar182 * fVar182) * auVar122._12_4_ + 1.0;
                auVar122 = vrcpps_avx(auVar93);
                fVar174 = auVar122._0_4_;
                fVar176 = auVar122._4_4_;
                fVar177 = auVar122._8_4_;
                fVar178 = auVar122._12_4_;
                auVar94._0_4_ = auVar93._0_4_ * (fVar174 + fVar174);
                auVar94._4_4_ = auVar93._4_4_ * (fVar176 + fVar176);
                auVar94._8_4_ = auVar93._8_4_ * (fVar177 + fVar177);
                auVar94._12_4_ = auVar93._12_4_ * (fVar178 + fVar178);
                auVar150._8_4_ = 0x40000000;
                auVar150._0_8_ = 0x4000000040000000;
                auVar150._12_4_ = 0x40000000;
                in_ZMM4 = ZEXT1664(auVar150);
                auVar122 = vsubps_avx(auVar150,auVar94);
                auVar95._0_4_ = fVar174 + fVar174 + -1.0 + fVar174 * auVar122._0_4_;
                auVar95._4_4_ = fVar176 + fVar176 + -1.0 + fVar176 * auVar122._4_4_;
                auVar95._8_4_ = fVar177 + fVar177 + -1.0 + fVar177 * auVar122._8_4_;
                auVar95._12_4_ = fVar178 + fVar178 + -1.0 + fVar178 * auVar122._12_4_;
                goto LAB_005049d4;
              case 6:
                fVar174 = **(float **)(&this->field_0xf8 + (long)p_Var8);
                fVar176 = (*(float **)(&this->field_0xf8 + (long)p_Var8))[1];
                auVar101._0_4_ = fVar174 * auVar69._0_4_ + fVar176;
                auVar101._4_4_ = fVar174 * auVar69._4_4_ + fVar176;
                auVar101._8_4_ = fVar174 * auVar69._8_4_ + fVar176;
                auVar101._12_4_ = fVar174 * auVar69._12_4_ + fVar176;
                auVar122 = vmaxps_avx(auVar101,_DAT_00554060);
                auVar95 = vminps_avx(auVar122,auVar155);
LAB_005049d4:
                auVar69._0_4_ = auVar95._0_4_ * auVar69._0_4_;
                auVar69._4_4_ = auVar95._4_4_ * auVar69._4_4_;
                auVar69._8_4_ = auVar95._8_4_ * auVar69._8_4_;
                auVar69._12_4_ = auVar95._12_4_ * auVar69._12_4_;
              }
              if (iVar43 == 1) {
                *(int *)*local_188 = auVar69._0_4_;
                uVar7 = vextractps_avx(auVar69,1);
                *(undefined4 *)((long)*local_188 + (long)iVar56 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar69,2);
                *(undefined4 *)((long)*local_188 + (long)(iVar56 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar69,3);
                *(undefined4 *)((long)*local_188 + (long)(iVar56 * 3) * 4) = uVar7;
                local_188 = (undefined1 (*) [16])((long)*local_188 + 4);
              }
              else if (iVar43 == 4) {
                *local_188 = auVar69;
                local_188 = local_188 + 1;
              }
              lVar30 = lVar30 + 1;
              iVar42 = iVar42 + iVar47 * local_c8.elempack;
              local_150 = local_150 + lVar29 * 4;
              local_118._0_8_ = local_118._0_8_ + lVar29 * 4;
            } while (lVar30 != lVar57);
          }
          local_170 = local_170 + 1;
        } while (local_170 != (uint)(iVar53 >> 2));
      }
      uVar37 = uVar49 * 8 + (iVar53 >> 2) * 4;
      local_60 = (ulong)uVar37;
      uVar32 = (ulong)(uint)((int)(iVar27 - uVar37) / 2);
      local_68 = uVar32;
      if (1 < (int)(iVar27 - uVar37)) {
        uVar50 = local_c8.h * local_c8.elempack;
        uVar49 = top_blob->w;
        local_70 = (long)(int)uVar49 * top_blob->elemsize;
        sVar10 = (this->weight_data_tm).elemsize;
        sVar11 = (this->weight_data_tm).cstep;
        iVar27 = local_c8.elempack * iVar47;
        bVar61 = local_c8.elempack == 1;
        local_f0 = uVar50 & 0xfffffff8;
        iVar56 = local_c8.elempack * iVar47;
        local_38 = top_blob->data;
        local_40 = (this->weight_data_tm).data;
        local_48 = (long)(int)uVar37;
        local_50 = lVar59 * 4;
        local_180 = 0;
        do {
          pvVar12 = local_c8.data;
          if (0 < (int)uVar49) {
            lVar57 = local_48 + local_180 * 2;
            puVar55 = (undefined4 *)((local_48 + local_180 * 2 + 1) * local_70 + (long)local_38);
            puVar58 = (undefined4 *)(lVar57 * local_70 + (long)local_38);
            uVar37 = (uint)lVar57;
            uVar51 = uVar37 + 3;
            uVar25 = uVar37 + 7;
            if (-1 < (int)uVar37) {
              uVar51 = uVar37;
              uVar25 = uVar37;
            }
            cVar22 = (char)lVar57 - ((byte)uVar25 & 0xf8);
            pfVar54 = (float *)((long)(((int)(uVar37 - (uVar51 & 0xfffffffc)) >> 1) +
                                       ((int)uVar25 >> 3) +
                                      (int)((char)(((byte)(cVar22 >> 7) >> 6) + cVar22) >> 2)) *
                                sVar10 * sVar11 + (long)local_40);
            lVar30 = (long)local_c8.w * local_c8.elemsize;
            pfVar48 = *(float **)(&this->field_0xf8 + (long)p_Var8);
            local_158 = (long)(_func_int ***)local_c8.data + local_50;
            iVar53 = 0;
            local_200 = (Allocator *)local_c8.data;
            local_1f8 = 0;
            do {
              if (lVar9 == 0) {
                fVar174 = 0.0;
                fVar176 = 0.0;
              }
              else {
                pfVar35 = (float *)(lVar9 + lVar57 * 4);
                fVar174 = *pfVar35;
                fVar176 = pfVar35[1];
              }
              pfVar35 = pfVar54;
              if ((int)uVar50 < 8) {
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                fVar88 = 0.0;
                fVar89 = 0.0;
                fVar185 = 0.0;
                fVar186 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar68 = 0.0;
                fVar83 = 0.0;
                uVar37 = 0;
              }
              else {
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar68 = 0.0;
                fVar83 = 0.0;
                fVar84 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                fVar88 = 0.0;
                fVar89 = 0.0;
                fVar185 = 0.0;
                fVar186 = 0.0;
                iVar43 = 0;
                do {
                  lVar31 = (iVar43 / iVar4) * lVar30;
                  if (iVar4 == 8) {
                    if (0 < iVar5) {
                      pfVar34 = (float *)((long)(_func_int ***)pvVar12 + lVar31 + (long)iVar53 * 4);
                      auVar153 = in_ZMM4;
                      iVar42 = iVar5;
                      do {
                        auVar171._0_4_ = *pfVar34 * *pfVar35;
                        auVar171._4_4_ = pfVar34[1] * pfVar35[1];
                        auVar171._8_4_ = pfVar34[2] * pfVar35[2];
                        auVar171._12_4_ = pfVar34[3] * pfVar35[3];
                        auVar171._16_4_ = pfVar34[4] * pfVar35[4];
                        auVar171._20_4_ = pfVar34[5] * pfVar35[5];
                        auVar171._28_36_ = auVar153._28_36_;
                        auVar171._24_4_ = pfVar34[6] * pfVar35[6];
                        in_ZMM4 = ZEXT3264(auVar171._0_32_);
                        fVar84 = auVar171._0_4_ + fVar84;
                        fVar85 = auVar171._4_4_ + fVar85;
                        fVar86 = auVar171._8_4_ + fVar86;
                        fVar87 = auVar171._12_4_ + fVar87;
                        fVar88 = auVar171._16_4_ + fVar88;
                        fVar89 = auVar171._20_4_ + fVar89;
                        fVar185 = auVar171._24_4_ + fVar185;
                        fVar186 = auVar153._28_4_ + fVar186;
                        fVar177 = *pfVar34 * pfVar35[8] + fVar177;
                        fVar178 = pfVar34[1] * pfVar35[9] + fVar178;
                        fVar179 = pfVar34[2] * pfVar35[10] + fVar179;
                        fVar180 = pfVar34[3] * pfVar35[0xb] + fVar180;
                        fVar181 = pfVar34[4] * pfVar35[0xc] + fVar181;
                        fVar182 = pfVar34[5] * pfVar35[0xd] + fVar182;
                        fVar68 = pfVar34[6] * pfVar35[0xe] + fVar68;
                        fVar83 = pfVar34[7] + fVar83;
                        pfVar35 = pfVar35 + 0x10;
                        pfVar34 = pfVar34 + iVar6 * 8;
                        iVar42 = iVar42 + -1;
                        auVar153 = in_ZMM4;
                      } while (iVar42 != 0);
                      goto LAB_00504e6b;
                    }
                  }
                  else {
                    pfVar34 = (float *)((long)(_func_int ***)pvVar12 +
                                       lVar31 + (long)(iVar27 * (int)local_1f8) * 4);
LAB_00504e6b:
                    if (iVar4 == 4) {
                      iVar42 = iVar5;
                      if (iVar5 < 1) goto LAB_00504f3a;
                      do {
                        auVar153._0_4_ = *pfVar34 * *pfVar35;
                        auVar153._4_4_ = pfVar34[1] * pfVar35[1];
                        auVar153._8_4_ = pfVar34[2] * pfVar35[2];
                        auVar153._12_4_ = pfVar34[3] * pfVar35[3];
                        auVar153._16_4_ = pfVar34[lVar59 + 4] * pfVar35[4];
                        auVar153._20_4_ = pfVar34[lVar59 + 5] * pfVar35[5];
                        auVar153._28_36_ = in_ZMM4._28_36_;
                        auVar153._24_4_ = pfVar34[lVar59 + 6] * pfVar35[6];
                        fVar84 = auVar153._0_4_ + fVar84;
                        fVar85 = auVar153._4_4_ + fVar85;
                        fVar86 = auVar153._8_4_ + fVar86;
                        fVar87 = auVar153._12_4_ + fVar87;
                        fVar88 = auVar153._16_4_ + fVar88;
                        fVar89 = auVar153._20_4_ + fVar89;
                        fVar185 = auVar153._24_4_ + fVar185;
                        fVar186 = in_ZMM4._28_4_ + fVar186;
                        fVar177 = *pfVar34 * pfVar35[8] + fVar177;
                        fVar178 = pfVar34[1] * pfVar35[9] + fVar178;
                        fVar179 = pfVar34[2] * pfVar35[10] + fVar179;
                        fVar180 = pfVar34[3] * pfVar35[0xb] + fVar180;
                        fVar181 = pfVar34[lVar59 + 4] * pfVar35[0xc] + fVar181;
                        fVar182 = pfVar34[lVar59 + 5] * pfVar35[0xd] + fVar182;
                        fVar68 = pfVar34[lVar59 + 6] * pfVar35[0xe] + fVar68;
                        fVar83 = pfVar34[lVar59 + 7] + fVar83;
                        pfVar35 = pfVar35 + 0x10;
                        pfVar34 = pfVar34 + iVar6 * 4;
                        iVar42 = iVar42 + -1;
                        in_ZMM4 = ZEXT3264(auVar153._0_32_);
                      } while (iVar42 != 0);
                    }
                    iVar42 = iVar5;
                    if (0 < iVar5 && bVar61) {
                      do {
                        auVar122 = vinsertps_avx(ZEXT416((uint)*pfVar34),
                                                 ZEXT416((uint)pfVar34[lVar59]),0x10);
                        auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar34[iVar24 * 2]),0x20);
                        auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar34[iVar24 * 3]),0x30);
                        auVar154 = vinsertps_avx(ZEXT416((uint)pfVar34[iVar24 * 4]),
                                                 ZEXT416((uint)pfVar34[iVar24 * 5]),0x10);
                        auVar154 = vinsertps_avx(auVar154,ZEXT416((uint)pfVar34[iVar24 * 6]),0x20);
                        auVar154 = vinsertps_avx(auVar154,ZEXT416((uint)pfVar34[iVar24 * 7]),0x30);
                        fVar187 = auVar122._0_4_ * *pfVar35;
                        fVar188 = auVar122._4_4_ * pfVar35[1];
                        fVar189 = auVar122._8_4_ * pfVar35[2];
                        fVar190 = auVar122._12_4_ * pfVar35[3];
                        fVar191 = auVar154._0_4_ * pfVar35[4];
                        fVar192 = auVar154._4_4_ * pfVar35[5];
                        fVar152 = auVar154._8_4_ * pfVar35[6];
                        in_ZMM4 = ZEXT2864(CONCAT424(fVar152,CONCAT420(fVar192,CONCAT416(fVar191,
                                                  CONCAT412(fVar190,CONCAT48(fVar189,CONCAT44(
                                                  fVar188,fVar187)))))));
                        fVar84 = fVar187 + fVar84;
                        fVar85 = fVar188 + fVar85;
                        fVar86 = fVar189 + fVar86;
                        fVar87 = fVar190 + fVar87;
                        fVar88 = fVar191 + fVar88;
                        fVar89 = fVar192 + fVar89;
                        fVar185 = fVar152 + fVar185;
                        fVar186 = fVar186 + 0.0;
                        fVar177 = auVar122._0_4_ * pfVar35[8] + fVar177;
                        fVar178 = auVar122._4_4_ * pfVar35[9] + fVar178;
                        fVar179 = auVar122._8_4_ * pfVar35[10] + fVar179;
                        fVar180 = auVar122._12_4_ * pfVar35[0xb] + fVar180;
                        fVar181 = auVar154._0_4_ * pfVar35[0xc] + fVar181;
                        fVar182 = auVar154._4_4_ * pfVar35[0xd] + fVar182;
                        fVar68 = auVar154._8_4_ * pfVar35[0xe] + fVar68;
                        fVar83 = auVar154._12_4_ + fVar83;
                        pfVar35 = pfVar35 + 0x10;
                        pfVar34 = pfVar34 + lVar28;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
LAB_00504f3a:
                  iVar42 = iVar43 + 0xf;
                  iVar43 = iVar43 + 8;
                  uVar37 = local_f0;
                } while (iVar42 < (int)uVar50);
              }
              auVar122 = ZEXT816(0) << 0x40;
              auVar153 = ZEXT1664(auVar122);
              if ((int)(uVar37 | 3) < (int)uVar50) {
                auVar171 = ZEXT864(0);
                uVar25 = uVar37;
                do {
                  lVar31 = ((int)uVar25 / iVar4) * lVar30;
                  if (iVar4 == 4) {
                    if (0 < iVar5) {
                      pfVar34 = (float *)((long)(_func_int ***)pvVar12 + lVar31 + (long)iVar53 * 4);
                      iVar43 = iVar5;
                      do {
                        auVar153 = ZEXT1664(CONCAT412(pfVar34[3] * pfVar35[3] + auVar153._12_4_,
                                                      CONCAT48(pfVar34[2] * pfVar35[2] +
                                                               auVar153._8_4_,
                                                               CONCAT44(pfVar34[1] * pfVar35[1] +
                                                                        auVar153._4_4_,
                                                                        *pfVar34 * *pfVar35 +
                                                                        auVar153._0_4_))));
                        auVar171 = ZEXT1664(CONCAT412(pfVar34[3] * pfVar35[7] + auVar171._12_4_,
                                                      CONCAT48(pfVar34[2] * pfVar35[6] +
                                                               auVar171._8_4_,
                                                               CONCAT44(pfVar34[1] * pfVar35[5] +
                                                                        auVar171._4_4_,
                                                                        *pfVar34 * pfVar35[4] +
                                                                        auVar171._0_4_))));
                        pfVar35 = pfVar35 + 8;
                        pfVar34 = pfVar34 + iVar6 * 4;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_00504ff1;
                    }
                  }
                  else {
                    pfVar34 = (float *)((long)(_func_int ***)pvVar12 +
                                       lVar31 + (long)(iVar27 * (int)local_1f8) * 4);
LAB_00504ff1:
                    iVar43 = iVar5;
                    if (0 < iVar5 && bVar61) {
                      do {
                        auVar122 = vinsertps_avx(ZEXT416((uint)*pfVar34),
                                                 ZEXT416((uint)pfVar34[lVar59]),0x10);
                        auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar34[iVar24 * 2]),0x20);
                        auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar34[iVar24 * 3]),0x30);
                        auVar153 = ZEXT1664(CONCAT412(auVar122._12_4_ * pfVar35[3] + auVar153._12_4_
                                                      ,CONCAT48(auVar122._8_4_ * pfVar35[2] +
                                                                auVar153._8_4_,
                                                                CONCAT44(auVar122._4_4_ * pfVar35[1]
                                                                         + auVar153._4_4_,
                                                                         auVar122._0_4_ * *pfVar35 +
                                                                         auVar153._0_4_))));
                        auVar171 = ZEXT1664(CONCAT412(auVar122._12_4_ * pfVar35[7] + auVar171._12_4_
                                                      ,CONCAT48(auVar122._8_4_ * pfVar35[6] +
                                                                auVar171._8_4_,
                                                                CONCAT44(auVar122._4_4_ * pfVar35[5]
                                                                         + auVar171._4_4_,
                                                                         auVar122._0_4_ * pfVar35[4]
                                                                         + auVar171._0_4_))));
                        pfVar35 = pfVar35 + 8;
                        pfVar34 = pfVar34 + lVar28;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
                  auVar154 = auVar171._0_16_;
                  auVar122 = auVar153._0_16_;
                  uVar37 = uVar25 + 4;
                  iVar43 = uVar25 + 7;
                  uVar25 = uVar37;
                } while (iVar43 < (int)uVar50);
              }
              else {
                auVar154 = SUB6416(ZEXT864(0),0);
              }
              uVar33 = (ulong)uVar37;
              auVar102._0_4_ = fVar88 + fVar84;
              auVar102._4_4_ = fVar89 + fVar85;
              auVar102._8_4_ = fVar185 + fVar86;
              auVar102._12_4_ = fVar186 + fVar87;
              auVar121 = vshufpd_avx(auVar102,auVar102,1);
              auVar103._0_4_ = auVar121._0_4_ + auVar102._0_4_;
              auVar103._4_4_ = auVar121._4_4_ + auVar102._4_4_;
              auVar103._8_4_ = auVar121._8_4_ + auVar102._8_4_;
              auVar103._12_4_ = auVar121._12_4_ + auVar102._12_4_;
              auVar73._0_4_ = fVar181 + fVar177;
              auVar73._4_4_ = fVar182 + fVar178;
              auVar73._8_4_ = fVar68 + fVar179;
              auVar73._12_4_ = fVar83 + fVar180;
              auVar121 = vshufpd_avx(auVar73,auVar73,1);
              auVar74._0_4_ = auVar121._0_4_ + auVar73._0_4_;
              auVar74._4_4_ = auVar121._4_4_ + auVar73._4_4_;
              auVar74._8_4_ = auVar121._8_4_ + auVar73._8_4_;
              auVar74._12_4_ = auVar121._12_4_ + auVar73._12_4_;
              auVar121 = vshufpd_avx(auVar122,auVar122,1);
              auVar151._0_4_ = auVar121._0_4_ + auVar122._0_4_;
              auVar151._4_4_ = auVar121._4_4_ + auVar122._4_4_;
              auVar151._8_4_ = auVar121._8_4_ + auVar122._8_4_;
              auVar151._12_4_ = auVar121._12_4_ + auVar122._12_4_;
              in_ZMM4 = ZEXT1664(auVar151);
              auVar122 = vinsertps_avx(auVar74,auVar103,0x4c);
              auVar121 = vshufpd_avx(auVar154,auVar154,1);
              auVar132._0_4_ = auVar121._0_4_ + auVar154._0_4_;
              auVar132._4_4_ = auVar121._4_4_ + auVar154._4_4_;
              auVar132._8_4_ = auVar121._8_4_ + auVar154._8_4_;
              auVar132._12_4_ = auVar121._12_4_ + auVar154._12_4_;
              auVar154 = vinsertps_avx(auVar103,auVar74,0x1c);
              auVar121 = vinsertps_avx(auVar132,auVar151,0x4c);
              auVar123 = vinsertps_avx(auVar151,auVar132,0x1c);
              auVar153 = ZEXT1664(CONCAT412(auVar122._12_4_ + 0.0 +
                                            auVar154._12_4_ + auVar121._12_4_ + auVar123._12_4_,
                                            CONCAT48(auVar122._8_4_ + 0.0 +
                                                     auVar154._8_4_ + auVar121._8_4_ +
                                                     auVar123._8_4_,
                                                     CONCAT44(auVar122._4_4_ + fVar176 +
                                                              auVar154._4_4_ + auVar121._4_4_ +
                                                              auVar123._4_4_,
                                                              auVar122._0_4_ + fVar174 +
                                                              auVar154._0_4_ + auVar121._0_4_ +
                                                              auVar123._0_4_))));
              if ((int)(uVar37 | 1) < (int)uVar50) {
                lVar31 = local_158 + lVar30 * uVar33;
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar30 * uVar33);
                do {
                  if (0 < iVar5) {
                    lVar38 = 0;
                    iVar43 = iVar5;
                    do {
                      fVar174 = *(float *)((long)ppp_Var40 + lVar38);
                      fVar176 = *(float *)(lVar31 + lVar38);
                      auVar153 = ZEXT1664(CONCAT412(fVar174 * 0.0 + auVar153._12_4_ + fVar176 * 0.0,
                                                    CONCAT48(fVar174 * 0.0 + auVar153._8_4_ +
                                                             fVar176 * 0.0,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar35 >>
                                                                             0x20) * fVar174 +
                                                                      auVar153._4_4_ +
                                                                      (float)((ulong)*(undefined8 *)
                                                                                      (pfVar35 + 2)
                                                                             >> 0x20) * fVar176,
                                                                      (float)*(undefined8 *)pfVar35
                                                                      * fVar174 + auVar153._0_4_ +
                                                                      (float)*(undefined8 *)
                                                                              (pfVar35 + 2) *
                                                                      fVar176))));
                      pfVar35 = pfVar35 + 4;
                      lVar38 = lVar38 + lVar28 * 4;
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  uVar33 = uVar33 + 2;
                  uVar37 = (uint)uVar33;
                  lVar31 = lVar31 + lVar30 * 2;
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar30 * 2);
                } while ((int)(uVar37 | 1) < (int)uVar50);
              }
              auVar122 = auVar153._0_16_;
              if ((int)uVar37 < (int)uVar50) {
                uVar33 = (ulong)uVar37;
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar30 * uVar33);
                do {
                  ppp_Var46 = ppp_Var40;
                  iVar43 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar174 = *(float *)ppp_Var46;
                      auVar153 = ZEXT1664(CONCAT412(fVar174 * 0.0 + auVar153._12_4_,
                                                    CONCAT48(fVar174 * 0.0 + auVar153._8_4_,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar35 >>
                                                                             0x20) * fVar174 +
                                                                      auVar153._4_4_,
                                                                      (float)*(undefined8 *)pfVar35
                                                                      * fVar174 + auVar153._0_4_))))
                      ;
                      pfVar35 = pfVar35 + 2;
                      ppp_Var46 = (_func_int ***)((long)ppp_Var46 + lVar28 * 4);
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  auVar122 = auVar153._0_16_;
                  uVar33 = uVar33 + 1;
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar30);
                } while ((int)uVar33 < (int)uVar50);
              }
              fVar174 = auVar122._0_4_;
              auVar156 = auVar122;
              switch((int)local_78) {
              case 1:
                auVar156 = vmaxps_avx(auVar122,_DAT_00554060);
                break;
              case 2:
                auVar154 = vcmpps_avx(ZEXT816(0) << 0x40,auVar122,1);
                fVar176 = *pfVar48;
                auVar76._4_4_ = fVar176;
                auVar76._0_4_ = fVar176;
                auVar76._8_4_ = fVar176;
                auVar76._12_4_ = fVar176;
                auVar106._8_4_ = 0x3f800000;
                auVar106._0_8_ = 0x3f8000003f800000;
                auVar106._12_4_ = 0x3f800000;
                auVar154 = vblendvps_avx(auVar76,auVar106,auVar154);
                goto LAB_00505329;
              case 3:
                auVar63._8_8_ = 0;
                auVar63._0_8_ = *(ulong *)pfVar48;
                auVar154 = vmaxss_avx(auVar63,auVar122);
                auVar121 = vinsertps_avx(auVar63,auVar154,0x10);
                auVar154 = vinsertps_avx(auVar63,auVar122,0x4c);
                auVar154 = vcmpps_avx(auVar154,auVar121,1);
                auVar122 = vinsertps_avx(auVar121,auVar122,0x4c);
                auVar122 = vblendvps_avx(auVar122,auVar63,auVar154);
                auVar156 = vshufps_avx(auVar122,auVar122,0xe1);
                auVar122 = vcmpps_avx(auVar63,auVar156,1);
                if ((auVar122 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  auVar156 = vinsertps_avx(auVar156,auVar63,0x50);
                }
                break;
              case 4:
                auVar104._8_4_ = 0x42b0c0a5;
                auVar104._0_8_ = 0x42b0c0a542b0c0a5;
                auVar104._12_4_ = 0x42b0c0a5;
                auVar154 = vminps_avx(auVar122,auVar104);
                auVar75._8_4_ = 0xc2b0c0a5;
                auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar75._12_4_ = 0xc2b0c0a5;
                auVar122 = vcmpps_avx(auVar154,auVar75,1);
                auVar64._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
                auVar64._8_4_ = auVar154._8_4_ ^ 0x80000000;
                auVar64._12_4_ = auVar154._12_4_ ^ 0x80000000;
                auVar122 = vblendvps_avx(auVar64,auVar104,auVar122);
                in_ZMM4 = ZEXT1664(auVar151);
                local_1a8._0_4_ = expf(auVar122._0_4_);
                local_1a8._4_4_ = extraout_XMM0_Db_00;
                local_1a8._8_4_ = extraout_XMM0_Dc_00;
                local_1a8._12_4_ = extraout_XMM0_Dd_00;
                auVar122 = vmovshdup_avx(auVar122);
                auVar158._0_4_ = expf(auVar122._0_4_);
                auVar158._4_60_ = extraout_var_00;
                auVar122 = vinsertps_avx(local_1a8,auVar158._0_16_,0x10);
                auVar105._8_4_ = 0x3f800000;
                auVar105._0_8_ = 0x3f8000003f800000;
                auVar105._12_4_ = 0x3f800000;
                auVar65._0_4_ = auVar122._0_4_ + 1.0;
                auVar65._4_4_ = auVar122._4_4_ + 1.0;
                auVar65._8_4_ = auVar122._8_4_ + 1.0;
                auVar65._12_4_ = auVar122._12_4_ + 1.0;
                auVar122 = vrcpps_avx(auVar65);
                fVar174 = auVar122._0_4_;
                auVar66._0_4_ = auVar65._0_4_ * fVar174;
                fVar176 = auVar122._4_4_;
                auVar66._4_4_ = auVar65._4_4_ * fVar176;
                fVar177 = auVar122._8_4_;
                auVar66._8_4_ = auVar65._8_4_ * fVar177;
                fVar178 = auVar122._12_4_;
                auVar66._12_4_ = auVar65._12_4_ * fVar178;
                auVar122 = vsubps_avx(auVar105,auVar66);
                auVar156._0_4_ = fVar174 + fVar174 * auVar122._0_4_;
                auVar156._4_4_ = fVar176 + fVar176 * auVar122._4_4_;
                auVar156._8_4_ = fVar177 + fVar177 * auVar122._8_4_;
                auVar156._12_4_ = fVar178 + fVar178 * auVar122._12_4_;
                break;
              case 5:
                in_ZMM4 = ZEXT1664(auVar151);
                fVar176 = expf(fVar174);
                fVar176 = logf(fVar176 + 1.0);
                local_118._0_4_ = tanhf(fVar176);
                local_118._4_4_ = extraout_XMM0_Db;
                local_118._8_4_ = extraout_XMM0_Dc;
                local_118._12_4_ = extraout_XMM0_Dd;
                auVar154 = vmovshdup_avx(auVar122);
                fVar176 = expf(auVar154._0_4_);
                fVar176 = logf(fVar176 + 1.0);
                auVar173._0_4_ = tanhf(fVar176);
                auVar173._4_60_ = extraout_var;
                auVar154 = vinsertps_avx(local_118,auVar173._0_16_,0x10);
LAB_00505329:
                auVar156._0_4_ = auVar154._0_4_ * fVar174;
                auVar156._4_4_ = auVar154._4_4_ * auVar122._4_4_;
                auVar156._8_4_ = auVar154._8_4_ * auVar122._8_4_;
                auVar156._12_4_ = auVar154._12_4_ * auVar122._12_4_;
                break;
              case 6:
                fVar176 = *pfVar48;
                fVar177 = pfVar48[1];
                fVar178 = -fVar177 / fVar176;
                auVar154 = SUB6416(ZEXT464(0),0) << 0x20;
                if ((fVar178 <= fVar174) &&
                   (auVar154 = auVar122, fVar174 <= fVar178 + 1.0 / fVar176)) {
                  auVar154 = ZEXT416((uint)((fVar176 * fVar174 + fVar177) * fVar174));
                }
                auVar121 = vmovshdup_avx(auVar122);
                in_ZMM4 = ZEXT1664(auVar121);
                fVar174 = auVar121._0_4_;
                if (fVar178 <= fVar174) {
                  auVar156._4_12_ = auVar122._4_12_;
                  auVar156._0_4_ = (float)auVar154._0_4_;
                  if (fVar174 <= fVar178 + 1.0 / fVar176) {
                    auVar156 = vinsertps_avx(auVar156,ZEXT416((uint)((fVar176 * fVar174 + fVar177) *
                                                                    fVar174)),0x10);
                  }
                }
                else {
                  auVar156 = vblendps_avx(auVar154,_DAT_00554060,0xe);
                }
              }
              *puVar58 = auVar156._0_4_;
              uVar7 = vextractps_avx(auVar156,1);
              *puVar55 = uVar7;
              puVar58 = puVar58 + 1;
              puVar55 = puVar55 + 1;
              local_1f8 = local_1f8 + 1;
              iVar53 = iVar53 + iVar56;
              local_158 = local_158 + lVar29 * 4;
              local_200 = (Allocator *)((long)&local_200->_vptr_Allocator + lVar29 * 4);
            } while (local_1f8 != uVar49);
          }
          local_180 = local_180 + 1;
        } while (local_180 != uVar32);
      }
      iVar27 = (int)local_60 + (int)local_68 * 2;
      if (iVar27 < (int)local_80) {
        pvVar12 = top_blob->data;
        iVar56 = top_blob->w;
        sVar10 = top_blob->elemsize;
        sVar11 = (this->weight_data_tm).elemsize;
        sVar13 = (this->weight_data_tm).cstep;
        bVar61 = 0 < iVar5;
        local_198 = uVar23 & 0xfffffff8;
        local_1c8 = (ulong)iVar27;
        pvVar14 = (this->weight_data_tm).data;
        do {
          pvVar21 = local_c8.data;
          if (0 < (int)local_58) {
            pfVar48 = (float *)((long)iVar56 * sVar10 * local_1c8 + (long)pvVar12);
            iVar27 = (int)local_1c8;
            iVar53 = iVar27 + 7;
            if (-1 < iVar27) {
              iVar53 = iVar27;
            }
            iVar43 = iVar27 + 3;
            if (-1 < iVar27) {
              iVar43 = iVar27;
            }
            cVar22 = (char)local_1c8 - ((byte)iVar53 & 0xf8);
            pfVar35 = (float *)((long)(int)((iVar27 - (((uint)(local_1c8 >> 0x1f) & 1) + iVar27 &
                                                      0xfffffffe)) + (iVar53 >> 3) +
                                            (int)((char)((char)local_1c8 - ((byte)iVar43 & 0xfc)) /
                                                 '\x02') +
                                           (int)((char)(((byte)(cVar22 >> 7) >> 6) + cVar22) >> 2))
                                * sVar11 * sVar13 + (long)pvVar14);
            lVar57 = (long)local_c8.w * local_c8.elemsize;
            pfVar54 = *(float **)(&this->field_0xf8 + (long)p_Var8);
            local_1e0 = (void *)((long)(_func_int ***)local_c8.data + lVar59 * 4);
            iVar27 = 0;
            local_200 = (Allocator *)local_c8.data;
            local_1f8 = 0;
            do {
              if (lVar9 == 0) {
                fVar174 = 0.0;
              }
              else {
                fVar174 = *(float *)(lVar9 + local_1c8 * 4);
              }
              pfVar34 = pfVar35;
              if ((int)uVar23 < 8) {
                fVar176 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar68 = 0.0;
                uVar37 = 0;
              }
              else {
                fVar176 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar181 = 0.0;
                fVar182 = 0.0;
                fVar68 = 0.0;
                iVar53 = 0;
                do {
                  lVar30 = (iVar53 / iVar4) * lVar57;
                  if (iVar4 == 8 && bVar61) {
                    pfVar36 = (float *)((long)(_func_int ***)pvVar21 + lVar30 + (long)iVar27 * 4);
                    iVar43 = iVar5;
                    do {
                      fVar176 = *pfVar34 * *pfVar36 + fVar176;
                      fVar177 = pfVar34[1] * pfVar36[1] + fVar177;
                      fVar178 = pfVar34[2] * pfVar36[2] + fVar178;
                      fVar179 = pfVar34[3] * pfVar36[3] + fVar179;
                      fVar180 = pfVar34[4] * pfVar36[4] + fVar180;
                      fVar181 = pfVar34[5] * pfVar36[5] + fVar181;
                      fVar182 = pfVar34[6] * pfVar36[6] + fVar182;
                      fVar68 = pfVar34[7] + fVar68;
                      pfVar34 = pfVar34 + 8;
                      pfVar36 = pfVar36 + iVar6 * 8;
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  else {
                    pfVar36 = (float *)((long)(_func_int ***)pvVar21 +
                                       lVar30 + (long)(iVar4 * iVar47 * (int)local_1f8) * 4);
                  }
                  if (iVar4 == 4) {
                    iVar43 = iVar5;
                    if (0 < iVar5) {
                      do {
                        fVar176 = *pfVar36 * *pfVar34 + fVar176;
                        fVar177 = pfVar36[1] * pfVar34[1] + fVar177;
                        fVar178 = pfVar36[2] * pfVar34[2] + fVar178;
                        fVar179 = pfVar36[3] * pfVar34[3] + fVar179;
                        fVar180 = pfVar36[lVar59 + 4] * pfVar34[4] + fVar180;
                        fVar181 = pfVar36[lVar59 + 5] * pfVar34[5] + fVar181;
                        fVar182 = pfVar36[lVar59 + 6] * pfVar34[6] + fVar182;
                        fVar68 = pfVar36[lVar59 + 7] + fVar68;
                        pfVar34 = pfVar34 + 8;
                        pfVar36 = pfVar36 + iVar6 * 4;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_005057ce;
                    }
                  }
                  else {
LAB_005057ce:
                    iVar43 = iVar5;
                    if (iVar4 == 1 && bVar61) {
                      do {
                        auVar122 = vinsertps_avx(ZEXT416((uint)*pfVar36),
                                                 ZEXT416((uint)pfVar36[lVar59]),0x10);
                        auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar36[iVar24 * 2]),0x20);
                        auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar36[iVar24 * 3]),0x30);
                        auVar154 = vinsertps_avx(ZEXT416((uint)pfVar36[iVar24 * 4]),
                                                 ZEXT416((uint)pfVar36[iVar24 * 5]),0x10);
                        auVar154 = vinsertps_avx(auVar154,ZEXT416((uint)pfVar36[iVar24 * 6]),0x20);
                        auVar154 = vinsertps_avx(auVar154,ZEXT416((uint)pfVar36[iVar24 * 7]),0x30);
                        fVar176 = auVar122._0_4_ * *pfVar34 + fVar176;
                        fVar177 = auVar122._4_4_ * pfVar34[1] + fVar177;
                        fVar178 = auVar122._8_4_ * pfVar34[2] + fVar178;
                        fVar179 = auVar122._12_4_ * pfVar34[3] + fVar179;
                        fVar180 = auVar154._0_4_ * pfVar34[4] + fVar180;
                        fVar181 = auVar154._4_4_ * pfVar34[5] + fVar181;
                        fVar182 = auVar154._8_4_ * pfVar34[6] + fVar182;
                        fVar68 = auVar154._12_4_ + fVar68;
                        pfVar34 = pfVar34 + 8;
                        pfVar36 = pfVar36 + lVar28;
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
                  iVar43 = iVar53 + 0xf;
                  iVar53 = iVar53 + 8;
                  uVar37 = local_198;
                } while (iVar43 < (int)uVar23);
              }
              auVar122 = ZEXT816(0) << 0x40;
              auVar153 = ZEXT1664(auVar122);
              if ((int)(uVar37 | 3) < (int)uVar23) {
                uVar49 = uVar37;
                do {
                  lVar30 = ((int)uVar49 / iVar4) * lVar57;
                  if (iVar4 == 4 && bVar61) {
                    pfVar36 = (float *)((long)(_func_int ***)pvVar21 + lVar30 + (long)iVar27 * 4);
                    iVar53 = iVar5;
                    do {
                      auVar153 = ZEXT1664(CONCAT412(pfVar34[3] * pfVar36[3] + auVar153._12_4_,
                                                    CONCAT48(pfVar34[2] * pfVar36[2] +
                                                             auVar153._8_4_,
                                                             CONCAT44(pfVar34[1] * pfVar36[1] +
                                                                      auVar153._4_4_,
                                                                      *pfVar34 * *pfVar36 +
                                                                      auVar153._0_4_))));
                      pfVar34 = pfVar34 + 4;
                      pfVar36 = pfVar36 + iVar6 * 4;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  else {
                    pfVar36 = (float *)((long)(_func_int ***)pvVar21 +
                                       lVar30 + (long)(iVar4 * iVar47 * (int)local_1f8) * 4);
                  }
                  iVar53 = iVar5;
                  if (iVar4 == 1 && bVar61) {
                    do {
                      auVar122 = vinsertps_avx(ZEXT416((uint)*pfVar36),
                                               ZEXT416((uint)pfVar36[lVar59]),0x10);
                      auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar36[iVar24 * 2]),0x20);
                      auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)pfVar36[iVar24 * 3]),0x30);
                      auVar153 = ZEXT1664(CONCAT412(auVar122._12_4_ * pfVar34[3] + auVar153._12_4_,
                                                    CONCAT48(auVar122._8_4_ * pfVar34[2] +
                                                             auVar153._8_4_,
                                                             CONCAT44(auVar122._4_4_ * pfVar34[1] +
                                                                      auVar153._4_4_,
                                                                      auVar122._0_4_ * *pfVar34 +
                                                                      auVar153._0_4_))));
                      pfVar34 = pfVar34 + 4;
                      pfVar36 = pfVar36 + lVar28;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar122 = auVar153._0_16_;
                  uVar37 = uVar49 + 4;
                  iVar53 = uVar49 + 7;
                  uVar49 = uVar37;
                } while (iVar53 < (int)uVar23);
              }
              uVar32 = (ulong)uVar37;
              auVar77._0_4_ = fVar180 + fVar176;
              auVar77._4_4_ = fVar181 + fVar177;
              auVar77._8_4_ = fVar182 + fVar178;
              auVar77._12_4_ = fVar68 + fVar179;
              auVar154 = vshufpd_avx(auVar77,auVar77,1);
              auVar78._0_4_ = auVar154._0_4_ + auVar77._0_4_;
              auVar78._4_4_ = auVar154._4_4_ + auVar77._4_4_;
              auVar78._8_4_ = auVar154._8_4_ + auVar77._8_4_;
              auVar78._12_4_ = auVar154._12_4_ + auVar77._12_4_;
              auVar154 = vmovshdup_avx(auVar78);
              auVar121 = vshufpd_avx(auVar122,auVar122,1);
              auVar107._0_4_ = auVar121._0_4_ + auVar122._0_4_;
              auVar107._4_4_ = auVar121._4_4_ + auVar122._4_4_;
              auVar107._8_4_ = auVar121._8_4_ + auVar122._8_4_;
              auVar107._12_4_ = auVar121._12_4_ + auVar122._12_4_;
              auVar122 = vmovshdup_avx(auVar107);
              auVar153 = ZEXT464((uint)(auVar154._0_4_ + fVar174 +
                                       auVar78._0_4_ + auVar122._0_4_ + auVar107._0_4_));
              if ((int)(uVar37 | 1) < (int)uVar23) {
                pvVar45 = (void *)((long)local_1e0 + lVar57 * uVar32);
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar57 * uVar32);
                do {
                  if (0 < iVar5) {
                    lVar30 = 0;
                    iVar53 = iVar5;
                    do {
                      auVar153 = ZEXT464((uint)(*pfVar34 * *(float *)((long)ppp_Var40 + lVar30) +
                                                auVar153._0_4_ +
                                               pfVar34[1] * *(float *)((long)pvVar45 + lVar30)));
                      pfVar34 = pfVar34 + 2;
                      lVar30 = lVar30 + lVar28 * 4;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  uVar32 = uVar32 + 2;
                  uVar37 = (uint)uVar32;
                  pvVar45 = (void *)((long)pvVar45 + lVar57 * 2);
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar57 * 2);
                } while ((int)(uVar37 | 1) < (int)uVar23);
              }
              auVar122 = auVar153._0_16_;
              if ((int)uVar37 < (int)uVar23) {
                uVar32 = (ulong)uVar37;
                ppp_Var40 = (_func_int ***)((long)&local_200->_vptr_Allocator + lVar57 * uVar32);
                do {
                  ppp_Var46 = ppp_Var40;
                  iVar53 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar153 = ZEXT464((uint)(*pfVar34 * *(float *)ppp_Var46 + auVar153._0_4_));
                      pfVar34 = pfVar34 + 1;
                      ppp_Var46 = (_func_int ***)((long)ppp_Var46 + lVar28 * 4);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar122 = auVar153._0_16_;
                  uVar32 = uVar32 + 1;
                  ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar57);
                } while ((int)uVar32 < (int)uVar23);
              }
              fVar176 = auVar122._0_4_;
              fVar174 = fVar176;
              switch((int)local_78) {
              case 1:
                auVar122 = vmaxss_avx(auVar122,ZEXT416(0));
                fVar174 = auVar122._0_4_;
                break;
              case 2:
                auVar122 = vcmpss_avx(ZEXT416(0) << 0x20,auVar122,1);
                auVar109._8_4_ = 0x3f800000;
                auVar109._0_8_ = 0x3f8000003f800000;
                auVar109._12_4_ = 0x3f800000;
                auVar122 = vblendvps_avx(ZEXT416((uint)*pfVar54),auVar109,auVar122);
                fVar174 = auVar122._0_4_ * fVar176;
                break;
              case 3:
                auVar122 = vmaxss_avx(auVar122,ZEXT416((uint)*pfVar54));
                fVar174 = auVar122._0_4_;
                if (pfVar54[1] < auVar122._0_4_) {
                  fVar174 = pfVar54[1];
                }
                break;
              case 4:
                auVar122 = vminss_avx(auVar122,ZEXT416(0x42b0c0a5));
                auVar79._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
                auVar79._8_4_ = auVar122._8_4_ ^ 0x80000000;
                auVar79._12_4_ = auVar122._12_4_ ^ 0x80000000;
                auVar122 = vcmpss_avx(auVar122,ZEXT416(0xc2b0c0a5),1);
                auVar108._8_4_ = 0x42b0c0a5;
                auVar108._0_8_ = 0x42b0c0a542b0c0a5;
                auVar108._12_4_ = 0x42b0c0a5;
                auVar122 = vblendvps_avx(auVar79,auVar108,auVar122);
                fVar174 = expf(auVar122._0_4_);
                fVar174 = 1.0 / (fVar174 + 1.0);
                break;
              case 5:
                fVar174 = expf(fVar176);
                fVar174 = logf(fVar174 + 1.0);
                fVar174 = tanhf(fVar174);
                fVar174 = fVar174 * fVar176;
                break;
              case 6:
                fVar177 = *pfVar54;
                fVar178 = -pfVar54[1] / fVar177;
                fVar174 = 0.0;
                if ((fVar178 <= fVar176) && (fVar174 = fVar176, fVar176 <= fVar178 + 1.0 / fVar177))
                {
                  fVar174 = (fVar177 * fVar176 + pfVar54[1]) * fVar176;
                }
              }
              *pfVar48 = fVar174;
              pfVar48 = pfVar48 + 1;
              local_1f8 = local_1f8 + 1;
              iVar27 = iVar27 + iVar47 * iVar4;
              local_1e0 = (void *)((long)local_1e0 + lVar29 * 4);
              local_200 = (Allocator *)((long)&local_200->_vptr_Allocator + lVar29 * 4);
            } while (local_1f8 != local_58);
          }
          local_1c8 = local_1c8 + 1;
        } while (local_1c8 != local_80);
      }
      iVar47 = 0;
    }
  }
  piVar19 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar47;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}